

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  long lVar59;
  bool bVar60;
  ulong uVar61;
  ulong uVar62;
  Geometry *geometry;
  long lVar63;
  byte bVar64;
  float fVar65;
  float fVar122;
  float fVar124;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar66;
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar128;
  float fVar129;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined4 uVar130;
  vint4 bi_2;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined8 uVar136;
  vint4 bi_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  vint4 bi;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vint4 ai;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar164;
  float fVar165;
  float fVar167;
  vint4 ai_1;
  undefined1 auVar166 [16];
  undefined1 auVar168 [32];
  float fVar169;
  uint uVar170;
  float fVar172;
  float fVar173;
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  LinearSpace3fa *local_530;
  Primitive *local_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined8 local_440;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar56 = (ulong)(byte)prim[1];
  lVar57 = uVar56 * 0x25;
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 4 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 5 + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 6 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0xf + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x11 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x1a + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x1b + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x1c + 6)));
  uVar130 = *(undefined4 *)(prim + lVar57 + 0x12);
  auVar183._4_4_ = uVar130;
  auVar183._0_4_ = uVar130;
  auVar183._8_4_ = uVar130;
  auVar183._12_4_ = uVar130;
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar67 = vsubps_avx512vl(auVar79,*(undefined1 (*) [16])(prim + lVar57 + 6));
  fVar146 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar57 + 0x16)) *
            *(float *)(prim + lVar57 + 0x1a);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar56 * 7 + 6);
  auVar22 = vpmovsxwd_avx(auVar79);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar56 * 0xb + 6);
  auVar23 = vpmovsxwd_avx(auVar84);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar56 * 9 + 6);
  auVar131 = vpmovsxwd_avx(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar56 * 0xd + 6);
  auVar138 = vpmovsxwd_avx(auVar80);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar56 * 0x12 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar79 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar79 = vinsertps_avx512f(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar67 = vmulps_avx512vl(auVar183,auVar67);
  auVar68 = vmulps_avx512vl(auVar183,auVar79);
  auVar69 = vcvtdq2ps_avx512vl(auVar21);
  auVar70 = vcvtdq2ps_avx512vl(auVar75);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar79 = vcvtdq2ps_avx(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar77);
  auVar80 = vcvtdq2ps_avx(auVar78);
  uVar130 = auVar68._0_4_;
  auVar151._4_4_ = uVar130;
  auVar151._0_4_ = uVar130;
  auVar151._8_4_ = uVar130;
  auVar151._12_4_ = uVar130;
  auVar21 = vshufps_avx(auVar68,auVar68,0x55);
  auVar75 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar74 = vmulps_avx512vl(auVar75,auVar71);
  auVar137._0_4_ = auVar75._0_4_ * auVar79._0_4_;
  auVar137._4_4_ = auVar75._4_4_ * auVar79._4_4_;
  auVar137._8_4_ = auVar75._8_4_ * auVar79._8_4_;
  auVar137._12_4_ = auVar75._12_4_ * auVar79._12_4_;
  auVar68._0_4_ = auVar80._0_4_ * auVar75._0_4_;
  auVar68._4_4_ = auVar80._4_4_ * auVar75._4_4_;
  auVar68._8_4_ = auVar80._8_4_ * auVar75._8_4_;
  auVar68._12_4_ = auVar80._12_4_ * auVar75._12_4_;
  auVar75 = vfmadd231ps_avx512vl(auVar74,auVar21,auVar70);
  auVar74 = vfmadd231ps_avx512vl(auVar137,auVar21,auVar73);
  auVar21 = vfmadd231ps_fma(auVar68,auVar81,auVar21);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar151,auVar69);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar151,auVar72);
  auVar21 = vfmadd231ps_fma(auVar21,auVar84,auVar151);
  auVar76 = vbroadcastss_avx512vl(auVar67);
  auVar77 = vshufps_avx512vl(auVar67,auVar67,0x55);
  auVar78 = vshufps_avx512vl(auVar67,auVar67,0xaa);
  auVar71 = vmulps_avx512vl(auVar78,auVar71);
  auVar79 = vmulps_avx512vl(auVar78,auVar79);
  auVar80 = vmulps_avx512vl(auVar78,auVar80);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar77,auVar70);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar77,auVar73);
  auVar81 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar81);
  auVar68 = vfmadd231ps_avx512vl(auVar71,auVar76,auVar69);
  auVar69 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar72);
  auVar67 = vfmadd231ps_fma(auVar81,auVar76,auVar84);
  auVar182._8_4_ = 0x7fffffff;
  auVar182._0_8_ = 0x7fffffff7fffffff;
  auVar182._12_4_ = 0x7fffffff;
  auVar79 = vandps_avx(auVar182,auVar75);
  auVar180._8_4_ = 0x219392ef;
  auVar180._0_8_ = 0x219392ef219392ef;
  auVar180._12_4_ = 0x219392ef;
  uVar62 = vcmpps_avx512vl(auVar79,auVar180,1);
  bVar60 = (bool)((byte)uVar62 & 1);
  auVar70._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar75._0_4_;
  bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar75._4_4_;
  bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar75._8_4_;
  bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar75._12_4_;
  auVar79 = vandps_avx(auVar182,auVar74);
  uVar62 = vcmpps_avx512vl(auVar79,auVar180,1);
  bVar60 = (bool)((byte)uVar62 & 1);
  auVar82._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar74._0_4_;
  bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar74._4_4_;
  bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar74._8_4_;
  bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar74._12_4_;
  auVar79 = vandps_avx(auVar182,auVar21);
  uVar62 = vcmpps_avx512vl(auVar79,auVar180,1);
  bVar60 = (bool)((byte)uVar62 & 1);
  auVar83._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar21._0_4_;
  bVar60 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar21._4_4_;
  bVar60 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar21._8_4_;
  bVar60 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar21._12_4_;
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = 0x3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar84 = vrcp14ps_avx512vl(auVar70);
  auVar79 = vfnmadd213ps_fma(auVar70,auVar84,auVar177);
  auVar81 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar79 = vfnmadd213ps_fma(auVar82,auVar84,auVar177);
  auVar80 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar83);
  auVar79 = vfnmadd213ps_fma(auVar83,auVar84,auVar177);
  auVar77 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar158._4_4_ = fVar146;
  auVar158._0_4_ = fVar146;
  auVar158._8_4_ = fVar146;
  auVar158._12_4_ = fVar146;
  auVar79 = vcvtdq2ps_avx(auVar22);
  auVar84 = vcvtdq2ps_avx(auVar23);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar78 = vfmadd213ps_fma(auVar84,auVar158,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar131);
  auVar84 = vcvtdq2ps_avx(auVar138);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar22 = vfmadd213ps_fma(auVar84,auVar158,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar6);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar56 * 0x16 + 6);
  auVar84 = vpmovsxwd_avx(auVar21);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar6 = vfmadd213ps_fma(auVar84,auVar158,auVar79);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar56 * 0x14 + 6);
  auVar79 = vpmovsxwd_avx(auVar75);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar56 * 0x18 + 6);
  auVar84 = vpmovsxwd_avx(auVar71);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar21 = vfmadd213ps_fma(auVar84,auVar158,auVar79);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar56 * 0x1d + 6);
  auVar79 = vpmovsxwd_avx(auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar56 * 0x21 + 6);
  auVar84 = vpmovsxwd_avx(auVar73);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar75 = vfmadd213ps_fma(auVar84,auVar158,auVar79);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar56 * 0x1f + 6);
  auVar79 = vpmovsxwd_avx(auVar74);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar56 * 0x23 + 6);
  auVar84 = vpmovsxwd_avx(auVar76);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar84 = vfmadd213ps_fma(auVar84,auVar158,auVar79);
  auVar79 = vsubps_avx(auVar78,auVar68);
  auVar159._0_4_ = auVar81._0_4_ * auVar79._0_4_;
  auVar159._4_4_ = auVar81._4_4_ * auVar79._4_4_;
  auVar159._8_4_ = auVar81._8_4_ * auVar79._8_4_;
  auVar159._12_4_ = auVar81._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar22,auVar68);
  auVar142._0_4_ = auVar81._0_4_ * auVar79._0_4_;
  auVar142._4_4_ = auVar81._4_4_ * auVar79._4_4_;
  auVar142._8_4_ = auVar81._8_4_ * auVar79._8_4_;
  auVar142._12_4_ = auVar81._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar6,auVar69);
  auVar166._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar166._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar166._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar166._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar21,auVar69);
  auVar138._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar138._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar138._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar138._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar75,auVar67);
  auVar69._0_4_ = auVar77._0_4_ * auVar79._0_4_;
  auVar69._4_4_ = auVar77._4_4_ * auVar79._4_4_;
  auVar69._8_4_ = auVar77._8_4_ * auVar79._8_4_;
  auVar69._12_4_ = auVar77._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar84,auVar67);
  auVar131._0_4_ = auVar77._0_4_ * auVar79._0_4_;
  auVar131._4_4_ = auVar77._4_4_ * auVar79._4_4_;
  auVar131._8_4_ = auVar77._8_4_ * auVar79._8_4_;
  auVar131._12_4_ = auVar77._12_4_ * auVar79._12_4_;
  auVar79 = vpminsd_avx(auVar159,auVar142);
  auVar84 = vpminsd_avx(auVar166,auVar138);
  auVar79 = vmaxps_avx(auVar79,auVar84);
  auVar84 = vpminsd_avx(auVar69,auVar131);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar77._4_4_ = uVar130;
  auVar77._0_4_ = uVar130;
  auVar77._8_4_ = uVar130;
  auVar77._12_4_ = uVar130;
  auVar84 = vmaxps_avx512vl(auVar84,auVar77);
  auVar79 = vmaxps_avx(auVar79,auVar84);
  auVar78._8_4_ = 0x3f7ffffa;
  auVar78._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar78._12_4_ = 0x3f7ffffa;
  local_3d0 = vmulps_avx512vl(auVar79,auVar78);
  auVar79 = vpmaxsd_avx(auVar159,auVar142);
  auVar84 = vpmaxsd_avx(auVar166,auVar138);
  auVar79 = vminps_avx(auVar79,auVar84);
  auVar84 = vpmaxsd_avx(auVar69,auVar131);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar22._4_4_ = uVar130;
  auVar22._0_4_ = uVar130;
  auVar22._8_4_ = uVar130;
  auVar22._12_4_ = uVar130;
  auVar84 = vminps_avx512vl(auVar84,auVar22);
  auVar79 = vminps_avx(auVar79,auVar84);
  auVar23._8_4_ = 0x3f800003;
  auVar23._0_8_ = 0x3f8000033f800003;
  auVar23._12_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar23);
  auVar84 = vpbroadcastd_avx512vl();
  uVar136 = vcmpps_avx512vl(local_3d0,auVar79,2);
  uVar24 = vpcmpgtd_avx512vl(auVar84,_DAT_01f4ad30);
  uVar62 = (ulong)((byte)uVar136 & 0xf & (byte)uVar24);
  local_530 = pre->ray_space + k;
  local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_528 = prim;
  for (; uVar62 != 0; uVar62 = (ulong)((uint)uVar62 & (uint)uVar62 + 0xf & (uint)uVar136)) {
    lVar57 = 0;
    for (uVar56 = uVar62; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      lVar57 = lVar57 + 1;
    }
    uVar7 = *(uint *)(local_528 + 2);
    pGVar9 = (context->scene->geometries).items[uVar7].ptr;
    uVar56 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                             (ulong)*(uint *)(local_528 + lVar57 * 4 + 6) *
                             pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    fVar146 = (pGVar9->time_range).lower;
    fVar146 = pGVar9->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar146) / ((pGVar9->time_range).upper - fVar146));
    auVar79 = vroundss_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),9);
    auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
    auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
    fVar146 = fVar146 - auVar79._0_4_;
    _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar59 = (long)(int)auVar79._0_4_ * 0x38;
    lVar57 = *(long *)(_Var10 + 0x10 + lVar59);
    lVar63 = *(long *)(_Var10 + 0x38 + lVar59);
    lVar11 = *(long *)(_Var10 + 0x48 + lVar59);
    auVar139._4_4_ = fVar146;
    auVar139._0_4_ = fVar146;
    auVar139._8_4_ = fVar146;
    auVar139._12_4_ = fVar146;
    pfVar3 = (float *)(lVar63 + uVar56 * lVar11);
    auVar178._0_4_ = fVar146 * *pfVar3;
    auVar178._4_4_ = fVar146 * pfVar3[1];
    auVar178._8_4_ = fVar146 * pfVar3[2];
    auVar178._12_4_ = fVar146 * pfVar3[3];
    pfVar3 = (float *)(lVar63 + (uVar56 + 1) * lVar11);
    auVar179._0_4_ = fVar146 * *pfVar3;
    auVar179._4_4_ = fVar146 * pfVar3[1];
    auVar179._8_4_ = fVar146 * pfVar3[2];
    auVar179._12_4_ = fVar146 * pfVar3[3];
    auVar79 = vmulps_avx512vl(auVar139,*(undefined1 (*) [16])(lVar63 + (uVar56 + 2) * lVar11));
    auVar84 = vmulps_avx512vl(auVar139,*(undefined1 (*) [16])(lVar63 + lVar11 * (uVar56 + 3)));
    lVar63 = *(long *)(_Var10 + lVar59);
    fVar146 = 1.0 - fVar146;
    auVar67._4_4_ = fVar146;
    auVar67._0_4_ = fVar146;
    auVar67._8_4_ = fVar146;
    auVar67._12_4_ = fVar146;
    local_5f0 = vfmadd231ps_fma(auVar178,auVar67,*(undefined1 (*) [16])(lVar63 + lVar57 * uVar56));
    local_600 = vfmadd231ps_fma(auVar179,auVar67,
                                *(undefined1 (*) [16])(lVar63 + lVar57 * (uVar56 + 1)));
    local_610 = vfmadd231ps_avx512vl
                          (auVar79,auVar67,*(undefined1 (*) [16])(lVar63 + lVar57 * (uVar56 + 2)));
    _local_470 = vfmadd231ps_avx512vl
                           (auVar84,auVar67,*(undefined1 (*) [16])(lVar63 + lVar57 * (uVar56 + 3)));
    iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar81 = vsubps_avx(local_5f0,auVar79);
    uVar130 = auVar81._0_4_;
    auVar143._4_4_ = uVar130;
    auVar143._0_4_ = uVar130;
    auVar143._8_4_ = uVar130;
    auVar143._12_4_ = uVar130;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    aVar4 = (local_530->vx).field_0;
    aVar5 = (local_530->vy).field_0;
    fVar146 = (local_530->vz).field_0.m128[0];
    fVar169 = *(float *)((long)&(local_530->vz).field_0 + 4);
    fVar172 = *(float *)((long)&(local_530->vz).field_0 + 8);
    fVar173 = *(float *)((long)&(local_530->vz).field_0 + 0xc);
    auVar171._0_4_ = fVar146 * auVar81._0_4_;
    auVar171._4_4_ = fVar169 * auVar81._4_4_;
    auVar171._8_4_ = fVar172 * auVar81._8_4_;
    auVar171._12_4_ = fVar173 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar5,auVar84);
    auVar80 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar143);
    auVar81 = vsubps_avx(local_600,auVar79);
    uVar130 = auVar81._0_4_;
    auVar144._4_4_ = uVar130;
    auVar144._0_4_ = uVar130;
    auVar144._8_4_ = uVar130;
    auVar144._12_4_ = uVar130;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar174._0_4_ = fVar146 * auVar81._0_4_;
    auVar174._4_4_ = fVar169 * auVar81._4_4_;
    auVar174._8_4_ = fVar172 * auVar81._8_4_;
    auVar174._12_4_ = fVar173 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar5,auVar84);
    auVar6 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar144);
    auVar81 = vsubps_avx512vl(local_610,auVar79);
    uVar130 = auVar81._0_4_;
    auVar145._4_4_ = uVar130;
    auVar145._0_4_ = uVar130;
    auVar145._8_4_ = uVar130;
    auVar145._12_4_ = uVar130;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar176._0_4_ = fVar146 * auVar81._0_4_;
    auVar176._4_4_ = fVar169 * auVar81._4_4_;
    auVar176._8_4_ = fVar172 * auVar81._8_4_;
    auVar176._12_4_ = fVar173 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar5,auVar84);
    auVar21 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar145);
    auVar84 = vsubps_avx512vl(_local_470,auVar79);
    uVar130 = auVar84._0_4_;
    auVar140._4_4_ = uVar130;
    auVar140._0_4_ = uVar130;
    auVar140._8_4_ = uVar130;
    auVar140._12_4_ = uVar130;
    auVar79 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar181._0_4_ = fVar146 * auVar84._0_4_;
    auVar181._4_4_ = fVar169 * auVar84._4_4_;
    auVar181._8_4_ = fVar172 * auVar84._8_4_;
    auVar181._12_4_ = fVar173 * auVar84._12_4_;
    auVar79 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar5,auVar79);
    auVar75 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar140);
    lVar57 = (long)iVar8 * 0x44;
    auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar57);
    uVar130 = auVar80._0_4_;
    local_4e0._4_4_ = uVar130;
    local_4e0._0_4_ = uVar130;
    local_4e0._8_4_ = uVar130;
    local_4e0._12_4_ = uVar130;
    local_4e0._16_4_ = uVar130;
    local_4e0._20_4_ = uVar130;
    local_4e0._24_4_ = uVar130;
    local_4e0._28_4_ = uVar130;
    auVar85._8_4_ = 1;
    auVar85._0_8_ = 0x100000001;
    auVar85._12_4_ = 1;
    auVar85._16_4_ = 1;
    auVar85._20_4_ = 1;
    auVar85._24_4_ = 1;
    auVar85._28_4_ = 1;
    local_4c0 = vpermps_avx2(auVar85,ZEXT1632(auVar80));
    auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar57 + 0x484);
    uVar130 = auVar6._0_4_;
    local_640._4_4_ = uVar130;
    local_640._0_4_ = uVar130;
    local_640._8_4_ = uVar130;
    local_640._12_4_ = uVar130;
    local_640._16_4_ = uVar130;
    local_640._20_4_ = uVar130;
    local_640._24_4_ = uVar130;
    local_640._28_4_ = uVar130;
    local_660 = vpermps_avx512vl(auVar85,ZEXT1632(auVar6));
    auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar57 + 0x908);
    local_5a0 = vbroadcastss_avx512vl(auVar21);
    local_500 = vpermps_avx512vl(auVar85,ZEXT1632(auVar21));
    auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar57 + 0xd8c);
    local_5c0 = vbroadcastss_avx512vl(auVar75);
    auVar193 = ZEXT3264(local_5c0);
    local_5e0 = vpermps_avx512vl(auVar85,ZEXT1632(auVar75));
    auVar195 = ZEXT3264(local_5e0);
    auVar85 = vmulps_avx512vl(local_5c0,auVar97);
    auVar86 = vmulps_avx512vl(local_5e0,auVar97);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,local_5a0);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar98,local_500);
    auVar79 = vfmadd231ps_fma(auVar85,auVar100,local_640);
    auVar85 = vfmadd231ps_avx512vl(auVar86,auVar100,local_660);
    auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar99,local_4e0);
    auVar88 = vfmadd231ps_avx512vl(auVar85,auVar99,local_4c0);
    auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar57);
    auVar86 = *(undefined1 (*) [32])(bezier_basis1 + lVar57 + 0x484);
    auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar57 + 0x908);
    auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar57 + 0xd8c);
    auVar89 = vmulps_avx512vl(local_5c0,auVar95);
    auVar90 = vmulps_avx512vl(local_5e0,auVar95);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar96,local_5a0);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_500);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,local_640);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,local_660);
    auVar71 = vfmadd231ps_fma(auVar89,auVar85,local_4e0);
    auVar72 = vfmadd231ps_fma(auVar90,auVar85,local_4c0);
    auVar89 = vsubps_avx512vl(ZEXT1632(auVar71),auVar87);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar72),auVar88);
    auVar91 = vmulps_avx512vl(auVar88,auVar89);
    auVar92 = vmulps_avx512vl(auVar87,auVar90);
    auVar91 = vsubps_avx512vl(auVar91,auVar92);
    auVar79 = vshufps_avx(local_5f0,local_5f0,0xff);
    uVar136 = auVar79._0_8_;
    local_80._8_8_ = uVar136;
    local_80._0_8_ = uVar136;
    local_80._16_8_ = uVar136;
    local_80._24_8_ = uVar136;
    auVar79 = vshufps_avx(local_600,local_600,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar79);
    auVar79 = vshufps_avx512vl(local_610,local_610,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar79);
    auVar79 = vshufps_avx512vl(_local_470,_local_470,0xff);
    uVar136 = auVar79._0_8_;
    register0x000012c8 = uVar136;
    local_e0 = uVar136;
    register0x000012d0 = uVar136;
    register0x000012d8 = uVar136;
    auVar92 = vmulps_avx512vl(_local_e0,auVar97);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_c0);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar100,local_a0);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_80);
    auVar93 = vmulps_avx512vl(_local_e0,auVar95);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar96,local_c0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar86,local_a0);
    auVar73 = vfmadd231ps_fma(auVar93,auVar85,local_80);
    auVar93 = vmulps_avx512vl(auVar90,auVar90);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar89);
    auVar94 = vmaxps_avx512vl(auVar92,ZEXT1632(auVar73));
    auVar94 = vmulps_avx512vl(auVar94,auVar94);
    auVar93 = vmulps_avx512vl(auVar94,auVar93);
    auVar91 = vmulps_avx512vl(auVar91,auVar91);
    uVar136 = vcmpps_avx512vl(auVar91,auVar93,2);
    auVar79 = vblendps_avx(auVar80,local_5f0,8);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar84 = vandps_avx512vl(auVar79,auVar81);
    auVar79 = vblendps_avx(auVar6,local_600,8);
    auVar79 = vandps_avx512vl(auVar79,auVar81);
    auVar84 = vmaxps_avx(auVar84,auVar79);
    auVar79 = vblendps_avx(auVar21,local_610,8);
    auVar74 = vandps_avx512vl(auVar79,auVar81);
    auVar79 = vblendps_avx(auVar75,_local_470,8);
    auVar79 = vandps_avx512vl(auVar79,auVar81);
    auVar79 = vmaxps_avx(auVar74,auVar79);
    auVar79 = vmaxps_avx(auVar84,auVar79);
    auVar84 = vmovshdup_avx(auVar79);
    auVar84 = vmaxss_avx(auVar84,auVar79);
    auVar79 = vshufpd_avx(auVar79,auVar79,1);
    auVar81 = vcvtsi2ss_avx512f(local_610,iVar8);
    auVar79 = vmaxss_avx(auVar79,auVar84);
    local_400._0_16_ = auVar81;
    fVar146 = auVar81._0_4_;
    auVar93._4_4_ = fVar146;
    auVar93._0_4_ = fVar146;
    auVar93._8_4_ = fVar146;
    auVar93._12_4_ = fVar146;
    auVar93._16_4_ = fVar146;
    auVar93._20_4_ = fVar146;
    auVar93._24_4_ = fVar146;
    auVar93._28_4_ = fVar146;
    uVar24 = vcmpps_avx512vl(auVar93,_DAT_01f7b060,0xe);
    bVar64 = (byte)uVar136 & (byte)uVar24;
    auVar79 = vmulss_avx512f(auVar79,ZEXT416(0x35000000));
    auVar91._8_4_ = 2;
    auVar91._0_8_ = 0x200000002;
    auVar91._12_4_ = 2;
    auVar91._16_4_ = 2;
    auVar91._20_4_ = 2;
    auVar91._24_4_ = 2;
    auVar91._28_4_ = 2;
    local_100 = vpermps_avx512vl(auVar91,ZEXT1632(auVar80));
    local_120 = vpermps_avx512vl(auVar91,ZEXT1632(auVar6));
    local_140 = vpermps_avx512vl(auVar91,ZEXT1632(auVar21));
    local_580 = vpermps_avx2(auVar91,ZEXT1632(auVar75));
    local_280 = vpbroadcastd_avx512vl();
    uVar170 = *(uint *)(ray + k * 4 + 0x60);
    auVar84 = local_100._0_16_;
    if (bVar64 == 0) {
      bVar60 = false;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar188 = ZEXT3264(auVar99);
      auVar84 = vxorps_avx512vl(auVar84,auVar84);
      auVar189 = ZEXT1664(auVar84);
      auVar190 = ZEXT3264(local_4e0);
      auVar191 = ZEXT3264(local_4c0);
      auVar187 = ZEXT3264(local_640);
      auVar186 = ZEXT3264(local_660);
      auVar192 = ZEXT3264(local_5a0);
      auVar194 = ZEXT3264(local_500);
    }
    else {
      local_520._0_16_ = ZEXT416(uVar170);
      local_4a0._0_16_ = auVar79;
      auVar95 = vmulps_avx512vl(local_580,auVar95);
      auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar95);
      auVar86 = vfmadd213ps_avx512vl(auVar86,local_120,auVar96);
      auVar95 = vfmadd213ps_avx512vl(auVar85,local_100,auVar86);
      auVar97 = vmulps_avx512vl(local_580,auVar97);
      auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
      auVar86 = vfmadd213ps_avx512vl(auVar100,local_120,auVar98);
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar57 + 0x1210);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar57 + 0x1694);
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar57 + 0x1b18);
      auVar85 = *(undefined1 (*) [32])(bezier_basis0 + lVar57 + 0x1f9c);
      auVar91 = vfmadd213ps_avx512vl(auVar99,local_100,auVar86);
      auVar99 = vmulps_avx512vl(local_5c0,auVar85);
      auVar86 = vmulps_avx512vl(local_5e0,auVar85);
      auVar85 = vmulps_avx512vl(local_580,auVar85);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_5a0);
      auVar81 = vfmadd231ps_fma(auVar86,auVar97,local_500);
      auVar97 = vfmadd231ps_avx512vl(auVar85,local_140,auVar97);
      auVar80 = vfmadd231ps_fma(auVar99,auVar98,local_640);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar98,local_660);
      auVar85 = vfmadd231ps_avx512vl(auVar97,local_120,auVar98);
      auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar100,local_4e0);
      auVar96 = vfmadd231ps_avx512vl(auVar99,auVar100,local_4c0);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar57 + 0x1210);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar57 + 0x1b18);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar57 + 0x1f9c);
      auVar85 = vfmadd231ps_avx512vl(auVar85,local_100,auVar100);
      auVar100 = vmulps_avx512vl(local_5c0,auVar97);
      auVar93 = vmulps_avx512vl(local_5e0,auVar97);
      auVar97 = vmulps_avx512vl(local_580,auVar97);
      auVar196 = ZEXT1664(auVar79);
      auVar94 = vfmadd231ps_avx512vl(auVar100,auVar98,local_5a0);
      auVar81 = vfmadd231ps_fma(auVar93,auVar98,local_500);
      auVar194 = ZEXT3264(local_500);
      auVar98 = vfmadd231ps_avx512vl(auVar97,local_140,auVar98);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar57 + 0x1694);
      auVar97 = vfmadd231ps_avx512vl(auVar94,auVar100,local_640);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar100,local_660);
      auVar100 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
      auVar98 = vfmadd231ps_avx512vl(auVar97,auVar99,local_4e0);
      auVar97 = vfmadd231ps_avx512vl(auVar93,auVar99,local_4c0);
      auVar93 = vfmadd231ps_avx512vl(auVar100,local_100,auVar99);
      auVar184._8_4_ = 0x7fffffff;
      auVar184._0_8_ = 0x7fffffff7fffffff;
      auVar184._12_4_ = 0x7fffffff;
      auVar184._16_4_ = 0x7fffffff;
      auVar184._20_4_ = 0x7fffffff;
      auVar184._24_4_ = 0x7fffffff;
      auVar184._28_4_ = 0x7fffffff;
      auVar99 = vandps_avx(auVar86,auVar184);
      auVar100 = vandps_avx(auVar96,auVar184);
      auVar100 = vmaxps_avx(auVar99,auVar100);
      auVar99 = vandps_avx(auVar85,auVar184);
      auVar99 = vmaxps_avx(auVar100,auVar99);
      auVar85 = vbroadcastss_avx512vl(auVar79);
      uVar56 = vcmpps_avx512vl(auVar99,auVar85,1);
      bVar60 = (bool)((byte)uVar56 & 1);
      auVar94._0_4_ = (float)((uint)bVar60 * auVar89._0_4_ | (uint)!bVar60 * auVar86._0_4_);
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar94._4_4_ = (float)((uint)bVar60 * auVar89._4_4_ | (uint)!bVar60 * auVar86._4_4_);
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar94._8_4_ = (float)((uint)bVar60 * auVar89._8_4_ | (uint)!bVar60 * auVar86._8_4_);
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar94._12_4_ = (float)((uint)bVar60 * auVar89._12_4_ | (uint)!bVar60 * auVar86._12_4_);
      bVar60 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar94._16_4_ = (float)((uint)bVar60 * auVar89._16_4_ | (uint)!bVar60 * auVar86._16_4_);
      bVar60 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar94._20_4_ = (float)((uint)bVar60 * auVar89._20_4_ | (uint)!bVar60 * auVar86._20_4_);
      bVar60 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar94._24_4_ = (float)((uint)bVar60 * auVar89._24_4_ | (uint)!bVar60 * auVar86._24_4_);
      bVar60 = SUB81(uVar56 >> 7,0);
      auVar94._28_4_ = (uint)bVar60 * auVar89._28_4_ | (uint)!bVar60 * auVar86._28_4_;
      bVar60 = (bool)((byte)uVar56 & 1);
      auVar111._0_4_ = (float)((uint)bVar60 * auVar90._0_4_ | (uint)!bVar60 * auVar96._0_4_);
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar60 * auVar90._4_4_ | (uint)!bVar60 * auVar96._4_4_);
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar60 * auVar90._8_4_ | (uint)!bVar60 * auVar96._8_4_);
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar60 * auVar90._12_4_ | (uint)!bVar60 * auVar96._12_4_);
      bVar60 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar60 * auVar90._16_4_ | (uint)!bVar60 * auVar96._16_4_);
      bVar60 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar60 * auVar90._20_4_ | (uint)!bVar60 * auVar96._20_4_);
      bVar60 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar60 * auVar90._24_4_ | (uint)!bVar60 * auVar96._24_4_);
      bVar60 = SUB81(uVar56 >> 7,0);
      auVar111._28_4_ = (uint)bVar60 * auVar90._28_4_ | (uint)!bVar60 * auVar96._28_4_;
      auVar99 = vandps_avx(auVar184,auVar98);
      auVar100 = vandps_avx(auVar97,auVar184);
      auVar100 = vmaxps_avx(auVar99,auVar100);
      auVar99 = vandps_avx(auVar93,auVar184);
      auVar99 = vmaxps_avx(auVar100,auVar99);
      uVar56 = vcmpps_avx512vl(auVar99,auVar85,1);
      bVar60 = (bool)((byte)uVar56 & 1);
      auVar101._0_4_ = (float)((uint)bVar60 * auVar89._0_4_ | (uint)!bVar60 * auVar98._0_4_);
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar60 * auVar89._4_4_ | (uint)!bVar60 * auVar98._4_4_);
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar60 * auVar89._8_4_ | (uint)!bVar60 * auVar98._8_4_);
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar60 * auVar89._12_4_ | (uint)!bVar60 * auVar98._12_4_);
      bVar60 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar101._16_4_ = (float)((uint)bVar60 * auVar89._16_4_ | (uint)!bVar60 * auVar98._16_4_);
      bVar60 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar101._20_4_ = (float)((uint)bVar60 * auVar89._20_4_ | (uint)!bVar60 * auVar98._20_4_);
      bVar60 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar101._24_4_ = (float)((uint)bVar60 * auVar89._24_4_ | (uint)!bVar60 * auVar98._24_4_);
      bVar60 = SUB81(uVar56 >> 7,0);
      auVar101._28_4_ = (uint)bVar60 * auVar89._28_4_ | (uint)!bVar60 * auVar98._28_4_;
      bVar60 = (bool)((byte)uVar56 & 1);
      auVar102._0_4_ = (float)((uint)bVar60 * auVar90._0_4_ | (uint)!bVar60 * auVar97._0_4_);
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar102._4_4_ = (float)((uint)bVar60 * auVar90._4_4_ | (uint)!bVar60 * auVar97._4_4_);
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar102._8_4_ = (float)((uint)bVar60 * auVar90._8_4_ | (uint)!bVar60 * auVar97._8_4_);
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar102._12_4_ = (float)((uint)bVar60 * auVar90._12_4_ | (uint)!bVar60 * auVar97._12_4_);
      bVar60 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar102._16_4_ = (float)((uint)bVar60 * auVar90._16_4_ | (uint)!bVar60 * auVar97._16_4_);
      bVar60 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar102._20_4_ = (float)((uint)bVar60 * auVar90._20_4_ | (uint)!bVar60 * auVar97._20_4_);
      bVar60 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar102._24_4_ = (float)((uint)bVar60 * auVar90._24_4_ | (uint)!bVar60 * auVar97._24_4_);
      bVar60 = SUB81(uVar56 >> 7,0);
      auVar102._28_4_ = (uint)bVar60 * auVar90._28_4_ | (uint)!bVar60 * auVar97._28_4_;
      auVar78 = vxorps_avx512vl(auVar84,auVar84);
      auVar189 = ZEXT1664(auVar78);
      auVar99 = vfmadd213ps_avx512vl(auVar94,auVar94,ZEXT1632(auVar78));
      auVar84 = vfmadd231ps_fma(auVar99,auVar111,auVar111);
      auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar169 = auVar98._0_4_;
      fVar172 = auVar98._4_4_;
      fVar173 = auVar98._8_4_;
      fVar165 = auVar98._12_4_;
      fVar164 = auVar98._16_4_;
      fVar167 = auVar98._20_4_;
      fVar65 = auVar98._24_4_;
      auVar99._4_4_ = fVar172 * fVar172 * fVar172 * auVar84._4_4_ * -0.5;
      auVar99._0_4_ = fVar169 * fVar169 * fVar169 * auVar84._0_4_ * -0.5;
      auVar99._8_4_ = fVar173 * fVar173 * fVar173 * auVar84._8_4_ * -0.5;
      auVar99._12_4_ = fVar165 * fVar165 * fVar165 * auVar84._12_4_ * -0.5;
      auVar99._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar99._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
      auVar99._24_4_ = fVar65 * fVar65 * fVar65 * -0.0;
      auVar99._28_4_ = 0;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar85,auVar98);
      auVar100._4_4_ = auVar111._4_4_ * auVar99._4_4_;
      auVar100._0_4_ = auVar111._0_4_ * auVar99._0_4_;
      auVar100._8_4_ = auVar111._8_4_ * auVar99._8_4_;
      auVar100._12_4_ = auVar111._12_4_ * auVar99._12_4_;
      auVar100._16_4_ = auVar111._16_4_ * auVar99._16_4_;
      auVar100._20_4_ = auVar111._20_4_ * auVar99._20_4_;
      auVar100._24_4_ = auVar111._24_4_ * auVar99._24_4_;
      auVar100._28_4_ = auVar98._28_4_;
      auVar98._4_4_ = auVar99._4_4_ * -auVar94._4_4_;
      auVar98._0_4_ = auVar99._0_4_ * -auVar94._0_4_;
      auVar98._8_4_ = auVar99._8_4_ * -auVar94._8_4_;
      auVar98._12_4_ = auVar99._12_4_ * -auVar94._12_4_;
      auVar98._16_4_ = auVar99._16_4_ * -auVar94._16_4_;
      auVar98._20_4_ = auVar99._20_4_ * -auVar94._20_4_;
      auVar98._24_4_ = auVar99._24_4_ * -auVar94._24_4_;
      auVar98._28_4_ = auVar94._28_4_ ^ 0x80000000;
      auVar89 = vmulps_avx512vl(auVar99,ZEXT1632(auVar78));
      auVar90 = ZEXT1632(auVar78);
      auVar97 = vfmadd213ps_avx512vl(auVar101,auVar101,auVar90);
      auVar84 = vfmadd231ps_fma(auVar97,auVar102,auVar102);
      auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
      fVar169 = auVar96._0_4_;
      fVar172 = auVar96._4_4_;
      fVar173 = auVar96._8_4_;
      fVar165 = auVar96._12_4_;
      fVar164 = auVar96._16_4_;
      fVar167 = auVar96._20_4_;
      fVar65 = auVar96._24_4_;
      auVar97._4_4_ = fVar172 * fVar172 * fVar172 * auVar84._4_4_ * -0.5;
      auVar97._0_4_ = fVar169 * fVar169 * fVar169 * auVar84._0_4_ * -0.5;
      auVar97._8_4_ = fVar173 * fVar173 * fVar173 * auVar84._8_4_ * -0.5;
      auVar97._12_4_ = fVar165 * fVar165 * fVar165 * auVar84._12_4_ * -0.5;
      auVar97._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar97._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
      auVar97._24_4_ = fVar65 * fVar65 * fVar65 * -0.0;
      auVar97._28_4_ = 0;
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar85,auVar96);
      auVar86._4_4_ = auVar102._4_4_ * auVar97._4_4_;
      auVar86._0_4_ = auVar102._0_4_ * auVar97._0_4_;
      auVar86._8_4_ = auVar102._8_4_ * auVar97._8_4_;
      auVar86._12_4_ = auVar102._12_4_ * auVar97._12_4_;
      auVar86._16_4_ = auVar102._16_4_ * auVar97._16_4_;
      auVar86._20_4_ = auVar102._20_4_ * auVar97._20_4_;
      auVar86._24_4_ = auVar102._24_4_ * auVar97._24_4_;
      auVar86._28_4_ = auVar96._28_4_;
      auVar96._4_4_ = -auVar101._4_4_ * auVar97._4_4_;
      auVar96._0_4_ = -auVar101._0_4_ * auVar97._0_4_;
      auVar96._8_4_ = -auVar101._8_4_ * auVar97._8_4_;
      auVar96._12_4_ = -auVar101._12_4_ * auVar97._12_4_;
      auVar96._16_4_ = -auVar101._16_4_ * auVar97._16_4_;
      auVar96._20_4_ = -auVar101._20_4_ * auVar97._20_4_;
      auVar96._24_4_ = -auVar101._24_4_ * auVar97._24_4_;
      auVar96._28_4_ = auVar99._28_4_;
      auVar99 = vmulps_avx512vl(auVar97,auVar90);
      auVar84 = vfmadd213ps_fma(auVar100,auVar92,auVar87);
      auVar81 = vfmadd213ps_fma(auVar98,auVar92,auVar88);
      auVar97 = vfmadd213ps_avx512vl(auVar89,auVar92,auVar91);
      auVar85 = vfmadd213ps_avx512vl(auVar86,ZEXT1632(auVar73),ZEXT1632(auVar71));
      auVar74 = vfnmadd213ps_fma(auVar100,auVar92,auVar87);
      auVar87 = ZEXT1632(auVar73);
      auVar80 = vfmadd213ps_fma(auVar96,auVar87,ZEXT1632(auVar72));
      auVar76 = vfnmadd213ps_fma(auVar98,auVar92,auVar88);
      auVar6 = vfmadd213ps_fma(auVar99,auVar87,auVar95);
      auVar100 = vfnmadd231ps_avx512vl(auVar91,auVar92,auVar89);
      auVar71 = vfnmadd213ps_fma(auVar86,auVar87,ZEXT1632(auVar71));
      auVar72 = vfnmadd213ps_fma(auVar96,auVar87,ZEXT1632(auVar72));
      auVar77 = vfnmadd231ps_fma(auVar95,ZEXT1632(auVar73),auVar99);
      auVar98 = vsubps_avx512vl(auVar85,ZEXT1632(auVar74));
      auVar99 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar76));
      auVar86 = vsubps_avx512vl(ZEXT1632(auVar6),auVar100);
      auVar96 = vmulps_avx512vl(auVar99,auVar100);
      auVar21 = vfmsub231ps_fma(auVar96,ZEXT1632(auVar76),auVar86);
      auVar95._4_4_ = auVar74._4_4_ * auVar86._4_4_;
      auVar95._0_4_ = auVar74._0_4_ * auVar86._0_4_;
      auVar95._8_4_ = auVar74._8_4_ * auVar86._8_4_;
      auVar95._12_4_ = auVar74._12_4_ * auVar86._12_4_;
      auVar95._16_4_ = auVar86._16_4_ * 0.0;
      auVar95._20_4_ = auVar86._20_4_ * 0.0;
      auVar95._24_4_ = auVar86._24_4_ * 0.0;
      auVar95._28_4_ = auVar86._28_4_;
      auVar86 = vfmsub231ps_avx512vl(auVar95,auVar100,auVar98);
      auVar87._4_4_ = auVar76._4_4_ * auVar98._4_4_;
      auVar87._0_4_ = auVar76._0_4_ * auVar98._0_4_;
      auVar87._8_4_ = auVar76._8_4_ * auVar98._8_4_;
      auVar87._12_4_ = auVar76._12_4_ * auVar98._12_4_;
      auVar87._16_4_ = auVar98._16_4_ * 0.0;
      auVar87._20_4_ = auVar98._20_4_ * 0.0;
      auVar87._24_4_ = auVar98._24_4_ * 0.0;
      auVar87._28_4_ = auVar98._28_4_;
      auVar75 = vfmsub231ps_fma(auVar87,ZEXT1632(auVar74),auVar99);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar90,auVar86);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,ZEXT1632(auVar21));
      auVar91 = ZEXT1632(auVar78);
      uVar56 = vcmpps_avx512vl(auVar99,auVar91,2);
      bVar55 = (byte)uVar56;
      fVar65 = (float)((uint)(bVar55 & 1) * auVar84._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar71._0_4_);
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      fVar122 = (float)((uint)bVar60 * auVar84._4_4_ | (uint)!bVar60 * auVar71._4_4_);
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      fVar124 = (float)((uint)bVar60 * auVar84._8_4_ | (uint)!bVar60 * auVar71._8_4_);
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      fVar126 = (float)((uint)bVar60 * auVar84._12_4_ | (uint)!bVar60 * auVar71._12_4_);
      auVar96 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar124,CONCAT44(fVar122,fVar65))));
      fVar66 = (float)((uint)(bVar55 & 1) * auVar81._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar72._0_4_);
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      fVar123 = (float)((uint)bVar60 * auVar81._4_4_ | (uint)!bVar60 * auVar72._4_4_);
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      fVar125 = (float)((uint)bVar60 * auVar81._8_4_ | (uint)!bVar60 * auVar72._8_4_);
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      fVar127 = (float)((uint)bVar60 * auVar81._12_4_ | (uint)!bVar60 * auVar72._12_4_);
      auVar95 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar125,CONCAT44(fVar123,fVar66))));
      auVar103._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar77._0_4_);
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar60 * auVar97._4_4_ | (uint)!bVar60 * auVar77._4_4_);
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar60 * auVar97._8_4_ | (uint)!bVar60 * auVar77._8_4_);
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar60 * auVar97._12_4_ | (uint)!bVar60 * auVar77._12_4_);
      fVar172 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar97._16_4_);
      auVar103._16_4_ = fVar172;
      fVar169 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar97._20_4_);
      auVar103._20_4_ = fVar169;
      fVar173 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar97._24_4_);
      auVar103._24_4_ = fVar173;
      iVar1 = (uint)(byte)(uVar56 >> 7) * auVar97._28_4_;
      auVar103._28_4_ = iVar1;
      auVar98 = vblendmps_avx512vl(ZEXT1632(auVar74),auVar85);
      auVar104._0_4_ =
           (uint)(bVar55 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar81._0_4_;
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar104._4_4_ = (uint)bVar60 * auVar98._4_4_ | (uint)!bVar60 * auVar81._4_4_;
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar104._8_4_ = (uint)bVar60 * auVar98._8_4_ | (uint)!bVar60 * auVar81._8_4_;
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar104._12_4_ = (uint)bVar60 * auVar98._12_4_ | (uint)!bVar60 * auVar81._12_4_;
      auVar104._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar98._16_4_;
      auVar104._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar98._20_4_;
      auVar104._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar98._24_4_;
      auVar104._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar98._28_4_;
      auVar98 = vblendmps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar80));
      auVar105._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar21._0_4_);
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar60 * auVar98._4_4_ | (uint)!bVar60 * auVar21._4_4_);
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar60 * auVar98._8_4_ | (uint)!bVar60 * auVar21._8_4_);
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar60 * auVar98._12_4_ | (uint)!bVar60 * auVar21._12_4_);
      fVar165 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar98._16_4_);
      auVar105._16_4_ = fVar165;
      fVar164 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar98._20_4_);
      auVar105._20_4_ = fVar164;
      fVar167 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar98._24_4_);
      auVar105._24_4_ = fVar167;
      auVar105._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar98._28_4_;
      auVar98 = vblendmps_avx512vl(auVar100,ZEXT1632(auVar6));
      auVar106._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar97._0_4_);
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar60 * auVar98._4_4_ | (uint)!bVar60 * auVar97._4_4_);
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar60 * auVar98._8_4_ | (uint)!bVar60 * auVar97._8_4_);
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar60 * auVar98._12_4_ | (uint)!bVar60 * auVar97._12_4_);
      bVar60 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar106._16_4_ = (float)((uint)bVar60 * auVar98._16_4_ | (uint)!bVar60 * auVar97._16_4_);
      bVar60 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar106._20_4_ = (float)((uint)bVar60 * auVar98._20_4_ | (uint)!bVar60 * auVar97._20_4_);
      bVar60 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar106._24_4_ = (float)((uint)bVar60 * auVar98._24_4_ | (uint)!bVar60 * auVar97._24_4_);
      bVar60 = SUB81(uVar56 >> 7,0);
      auVar106._28_4_ = (uint)bVar60 * auVar98._28_4_ | (uint)!bVar60 * auVar97._28_4_;
      auVar107._0_4_ =
           (uint)(bVar55 & 1) * (int)auVar74._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar85._0_4_;
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar60 * (int)auVar74._4_4_ | (uint)!bVar60 * auVar85._4_4_;
      bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar60 * (int)auVar74._8_4_ | (uint)!bVar60 * auVar85._8_4_;
      bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar60 * (int)auVar74._12_4_ | (uint)!bVar60 * auVar85._12_4_;
      auVar107._16_4_ = (uint)!(bool)((byte)(uVar56 >> 4) & 1) * auVar85._16_4_;
      auVar107._20_4_ = (uint)!(bool)((byte)(uVar56 >> 5) & 1) * auVar85._20_4_;
      auVar107._24_4_ = (uint)!(bool)((byte)(uVar56 >> 6) & 1) * auVar85._24_4_;
      auVar107._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar85._28_4_;
      bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar56 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar108._0_4_ =
           (uint)(bVar55 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar6._0_4_;
      bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar6._4_4_;
      bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar6._8_4_;
      bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar6._12_4_;
      auVar108._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar100._16_4_;
      auVar108._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar100._20_4_;
      auVar108._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar100._24_4_;
      iVar2 = (uint)(byte)(uVar56 >> 7) * auVar100._28_4_;
      auVar108._28_4_ = iVar2;
      auVar87 = vsubps_avx512vl(auVar107,auVar96);
      auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar76._12_4_ |
                                               (uint)!bVar16 * auVar80._12_4_,
                                               CONCAT48((uint)bVar14 * (int)auVar76._8_4_ |
                                                        (uint)!bVar14 * auVar80._8_4_,
                                                        CONCAT44((uint)bVar60 * (int)auVar76._4_4_ |
                                                                 (uint)!bVar60 * auVar80._4_4_,
                                                                 (uint)(bVar55 & 1) *
                                                                 (int)auVar76._0_4_ |
                                                                 (uint)!(bool)(bVar55 & 1) *
                                                                 auVar80._0_4_)))),auVar95);
      auVar98 = vsubps_avx(auVar108,auVar103);
      auVar97 = vsubps_avx(auVar96,auVar104);
      auVar85 = vsubps_avx(auVar95,auVar105);
      auVar86 = vsubps_avx(auVar103,auVar106);
      auVar88._4_4_ = auVar98._4_4_ * fVar122;
      auVar88._0_4_ = auVar98._0_4_ * fVar65;
      auVar88._8_4_ = auVar98._8_4_ * fVar124;
      auVar88._12_4_ = auVar98._12_4_ * fVar126;
      auVar88._16_4_ = auVar98._16_4_ * 0.0;
      auVar88._20_4_ = auVar98._20_4_ * 0.0;
      auVar88._24_4_ = auVar98._24_4_ * 0.0;
      auVar88._28_4_ = iVar2;
      auVar84 = vfmsub231ps_fma(auVar88,auVar103,auVar87);
      auVar89._4_4_ = fVar123 * auVar87._4_4_;
      auVar89._0_4_ = fVar66 * auVar87._0_4_;
      auVar89._8_4_ = fVar125 * auVar87._8_4_;
      auVar89._12_4_ = fVar127 * auVar87._12_4_;
      auVar89._16_4_ = auVar87._16_4_ * 0.0;
      auVar89._20_4_ = auVar87._20_4_ * 0.0;
      auVar89._24_4_ = auVar87._24_4_ * 0.0;
      auVar89._28_4_ = auVar99._28_4_;
      auVar81 = vfmsub231ps_fma(auVar89,auVar96,auVar100);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar91,ZEXT1632(auVar84));
      auVar152._0_4_ = auVar100._0_4_ * auVar103._0_4_;
      auVar152._4_4_ = auVar100._4_4_ * auVar103._4_4_;
      auVar152._8_4_ = auVar100._8_4_ * auVar103._8_4_;
      auVar152._12_4_ = auVar100._12_4_ * auVar103._12_4_;
      auVar152._16_4_ = auVar100._16_4_ * fVar172;
      auVar152._20_4_ = auVar100._20_4_ * fVar169;
      auVar152._24_4_ = auVar100._24_4_ * fVar173;
      auVar152._28_4_ = 0;
      auVar84 = vfmsub231ps_fma(auVar152,auVar95,auVar98);
      auVar88 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar84));
      auVar99 = vmulps_avx512vl(auVar86,auVar104);
      auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar106);
      auVar90._4_4_ = auVar85._4_4_ * auVar106._4_4_;
      auVar90._0_4_ = auVar85._0_4_ * auVar106._0_4_;
      auVar90._8_4_ = auVar85._8_4_ * auVar106._8_4_;
      auVar90._12_4_ = auVar85._12_4_ * auVar106._12_4_;
      auVar90._16_4_ = auVar85._16_4_ * auVar106._16_4_;
      auVar90._20_4_ = auVar85._20_4_ * auVar106._20_4_;
      auVar90._24_4_ = auVar85._24_4_ * auVar106._24_4_;
      auVar90._28_4_ = auVar106._28_4_;
      auVar84 = vfmsub231ps_fma(auVar90,auVar105,auVar86);
      auVar153._0_4_ = auVar105._0_4_ * auVar97._0_4_;
      auVar153._4_4_ = auVar105._4_4_ * auVar97._4_4_;
      auVar153._8_4_ = auVar105._8_4_ * auVar97._8_4_;
      auVar153._12_4_ = auVar105._12_4_ * auVar97._12_4_;
      auVar153._16_4_ = fVar165 * auVar97._16_4_;
      auVar153._20_4_ = fVar164 * auVar97._20_4_;
      auVar153._24_4_ = fVar167 * auVar97._24_4_;
      auVar153._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar153,auVar85,auVar104);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar91,auVar99);
      auVar89 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar84));
      auVar99 = vmaxps_avx(auVar88,auVar89);
      uVar136 = vcmpps_avx512vl(auVar99,auVar91,2);
      bVar64 = bVar64 & (byte)uVar136;
      auVar190 = ZEXT3264(local_4e0);
      auVar191 = ZEXT3264(local_4c0);
      auVar187 = ZEXT3264(local_640);
      auVar186 = ZEXT3264(local_660);
      if (bVar64 == 0) {
        bVar60 = false;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar188 = ZEXT3264(auVar99);
        auVar192 = ZEXT3264(local_5a0);
        auVar193 = ZEXT3264(local_5c0);
        auVar195 = ZEXT3264(local_5e0);
      }
      else {
        auVar31._4_4_ = auVar86._4_4_ * auVar100._4_4_;
        auVar31._0_4_ = auVar86._0_4_ * auVar100._0_4_;
        auVar31._8_4_ = auVar86._8_4_ * auVar100._8_4_;
        auVar31._12_4_ = auVar86._12_4_ * auVar100._12_4_;
        auVar31._16_4_ = auVar86._16_4_ * auVar100._16_4_;
        auVar31._20_4_ = auVar86._20_4_ * auVar100._20_4_;
        auVar31._24_4_ = auVar86._24_4_ * auVar100._24_4_;
        auVar31._28_4_ = auVar99._28_4_;
        auVar80 = vfmsub231ps_fma(auVar31,auVar85,auVar98);
        auVar32._4_4_ = auVar98._4_4_ * auVar97._4_4_;
        auVar32._0_4_ = auVar98._0_4_ * auVar97._0_4_;
        auVar32._8_4_ = auVar98._8_4_ * auVar97._8_4_;
        auVar32._12_4_ = auVar98._12_4_ * auVar97._12_4_;
        auVar32._16_4_ = auVar98._16_4_ * auVar97._16_4_;
        auVar32._20_4_ = auVar98._20_4_ * auVar97._20_4_;
        auVar32._24_4_ = auVar98._24_4_ * auVar97._24_4_;
        auVar32._28_4_ = auVar98._28_4_;
        auVar81 = vfmsub231ps_fma(auVar32,auVar87,auVar86);
        auVar33._4_4_ = auVar85._4_4_ * auVar87._4_4_;
        auVar33._0_4_ = auVar85._0_4_ * auVar87._0_4_;
        auVar33._8_4_ = auVar85._8_4_ * auVar87._8_4_;
        auVar33._12_4_ = auVar85._12_4_ * auVar87._12_4_;
        auVar33._16_4_ = auVar85._16_4_ * auVar87._16_4_;
        auVar33._20_4_ = auVar85._20_4_ * auVar87._20_4_;
        auVar33._24_4_ = auVar85._24_4_ * auVar87._24_4_;
        auVar33._28_4_ = auVar85._28_4_;
        auVar6 = vfmsub231ps_fma(auVar33,auVar97,auVar100);
        auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar6));
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar80),auVar91);
        auVar100 = vrcp14ps_avx512vl(auVar99);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar188 = ZEXT3264(auVar98);
        auVar97 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar98);
        auVar84 = vfmadd132ps_fma(auVar97,auVar100,auVar100);
        auVar34._4_4_ = auVar6._4_4_ * auVar103._4_4_;
        auVar34._0_4_ = auVar6._0_4_ * auVar103._0_4_;
        auVar34._8_4_ = auVar6._8_4_ * auVar103._8_4_;
        auVar34._12_4_ = auVar6._12_4_ * auVar103._12_4_;
        auVar34._16_4_ = fVar172 * 0.0;
        auVar34._20_4_ = fVar169 * 0.0;
        auVar34._24_4_ = fVar173 * 0.0;
        auVar34._28_4_ = iVar1;
        auVar81 = vfmadd231ps_fma(auVar34,auVar95,ZEXT1632(auVar81));
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar96,ZEXT1632(auVar80));
        fVar169 = auVar84._0_4_;
        fVar172 = auVar84._4_4_;
        fVar173 = auVar84._8_4_;
        fVar165 = auVar84._12_4_;
        local_380 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar165,
                                       CONCAT48(auVar81._8_4_ * fVar173,
                                                CONCAT44(auVar81._4_4_ * fVar172,
                                                         auVar81._0_4_ * fVar169))));
        auVar168._4_4_ = uVar170;
        auVar168._0_4_ = uVar170;
        auVar168._8_4_ = uVar170;
        auVar168._12_4_ = uVar170;
        auVar168._16_4_ = uVar170;
        auVar168._20_4_ = uVar170;
        auVar168._24_4_ = uVar170;
        auVar168._28_4_ = uVar170;
        uVar136 = vcmpps_avx512vl(auVar168,local_380,2);
        uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar26._4_4_ = uVar130;
        auVar26._0_4_ = uVar130;
        auVar26._8_4_ = uVar130;
        auVar26._12_4_ = uVar130;
        auVar26._16_4_ = uVar130;
        auVar26._20_4_ = uVar130;
        auVar26._24_4_ = uVar130;
        auVar26._28_4_ = uVar130;
        uVar24 = vcmpps_avx512vl(local_380,auVar26,2);
        bVar64 = (byte)uVar136 & (byte)uVar24 & bVar64;
        auVar192 = ZEXT3264(local_5a0);
        auVar193 = ZEXT3264(local_5c0);
        auVar195 = ZEXT3264(local_5e0);
        if (bVar64 != 0) {
          uVar136 = vcmpps_avx512vl(auVar99,auVar91,4);
          bVar64 = bVar64 & (byte)uVar136;
          if (bVar64 != 0) {
            fVar164 = auVar88._0_4_ * fVar169;
            fVar167 = auVar88._4_4_ * fVar172;
            auVar35._4_4_ = fVar167;
            auVar35._0_4_ = fVar164;
            fVar65 = auVar88._8_4_ * fVar173;
            auVar35._8_4_ = fVar65;
            fVar66 = auVar88._12_4_ * fVar165;
            auVar35._12_4_ = fVar66;
            fVar122 = auVar88._16_4_ * 0.0;
            auVar35._16_4_ = fVar122;
            fVar123 = auVar88._20_4_ * 0.0;
            auVar35._20_4_ = fVar123;
            fVar124 = auVar88._24_4_ * 0.0;
            auVar35._24_4_ = fVar124;
            auVar35._28_4_ = auVar99._28_4_;
            auVar100 = vsubps_avx512vl(auVar98,auVar35);
            local_3c0._0_4_ =
                 (float)((uint)(bVar55 & 1) * (int)fVar164 |
                        (uint)!(bool)(bVar55 & 1) * auVar100._0_4_);
            bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
            local_3c0._4_4_ = (float)((uint)bVar60 * (int)fVar167 | (uint)!bVar60 * auVar100._4_4_);
            bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
            local_3c0._8_4_ = (float)((uint)bVar60 * (int)fVar65 | (uint)!bVar60 * auVar100._8_4_);
            bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
            local_3c0._12_4_ = (float)((uint)bVar60 * (int)fVar66 | (uint)!bVar60 * auVar100._12_4_)
            ;
            bVar60 = (bool)((byte)(uVar56 >> 4) & 1);
            local_3c0._16_4_ =
                 (float)((uint)bVar60 * (int)fVar122 | (uint)!bVar60 * auVar100._16_4_);
            bVar60 = (bool)((byte)(uVar56 >> 5) & 1);
            local_3c0._20_4_ =
                 (float)((uint)bVar60 * (int)fVar123 | (uint)!bVar60 * auVar100._20_4_);
            bVar60 = (bool)((byte)(uVar56 >> 6) & 1);
            local_3c0._24_4_ =
                 (float)((uint)bVar60 * (int)fVar124 | (uint)!bVar60 * auVar100._24_4_);
            bVar60 = SUB81(uVar56 >> 7,0);
            local_3c0._28_4_ =
                 (float)((uint)bVar60 * auVar99._28_4_ | (uint)!bVar60 * auVar100._28_4_);
            auVar99 = vsubps_avx(ZEXT1632(auVar73),auVar92);
            auVar84 = vfmadd213ps_fma(auVar99,local_3c0,auVar92);
            uVar130 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar92._4_4_ = uVar130;
            auVar92._0_4_ = uVar130;
            auVar92._8_4_ = uVar130;
            auVar92._12_4_ = uVar130;
            auVar92._16_4_ = uVar130;
            auVar92._20_4_ = uVar130;
            auVar92._24_4_ = uVar130;
            auVar92._28_4_ = uVar130;
            auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                                         CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                                                  CONCAT44(auVar84._4_4_ +
                                                                           auVar84._4_4_,
                                                                           auVar84._0_4_ +
                                                                           auVar84._0_4_)))),auVar92
                                     );
            uVar136 = vcmpps_avx512vl(local_380,auVar99,6);
            if (((byte)uVar136 & bVar64) != 0) {
              auVar149._0_4_ = auVar89._0_4_ * fVar169;
              auVar149._4_4_ = auVar89._4_4_ * fVar172;
              auVar149._8_4_ = auVar89._8_4_ * fVar173;
              auVar149._12_4_ = auVar89._12_4_ * fVar165;
              auVar149._16_4_ = auVar89._16_4_ * 0.0;
              auVar149._20_4_ = auVar89._20_4_ * 0.0;
              auVar149._24_4_ = auVar89._24_4_ * 0.0;
              auVar149._28_4_ = 0;
              auVar99 = vsubps_avx512vl(auVar98,auVar149);
              auVar109._0_4_ =
                   (uint)(bVar55 & 1) * (int)auVar149._0_4_ |
                   (uint)!(bool)(bVar55 & 1) * auVar99._0_4_;
              bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
              auVar109._4_4_ = (uint)bVar60 * (int)auVar149._4_4_ | (uint)!bVar60 * auVar99._4_4_;
              bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
              auVar109._8_4_ = (uint)bVar60 * (int)auVar149._8_4_ | (uint)!bVar60 * auVar99._8_4_;
              bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
              auVar109._12_4_ = (uint)bVar60 * (int)auVar149._12_4_ | (uint)!bVar60 * auVar99._12_4_
              ;
              bVar60 = (bool)((byte)(uVar56 >> 4) & 1);
              auVar109._16_4_ = (uint)bVar60 * (int)auVar149._16_4_ | (uint)!bVar60 * auVar99._16_4_
              ;
              bVar60 = (bool)((byte)(uVar56 >> 5) & 1);
              auVar109._20_4_ = (uint)bVar60 * (int)auVar149._20_4_ | (uint)!bVar60 * auVar99._20_4_
              ;
              bVar60 = (bool)((byte)(uVar56 >> 6) & 1);
              auVar109._24_4_ = (uint)bVar60 * (int)auVar149._24_4_ | (uint)!bVar60 * auVar99._24_4_
              ;
              auVar109._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar99._28_4_;
              auVar27._8_4_ = 0x40000000;
              auVar27._0_8_ = 0x4000000040000000;
              auVar27._12_4_ = 0x40000000;
              auVar27._16_4_ = 0x40000000;
              auVar27._20_4_ = 0x40000000;
              auVar27._24_4_ = 0x40000000;
              auVar27._28_4_ = 0x40000000;
              local_3a0 = vfmsub132ps_avx512vl(auVar109,auVar98,auVar27);
              local_360 = 0;
              local_350 = local_5f0._0_8_;
              uStack_348 = local_5f0._8_8_;
              local_340 = local_600._0_8_;
              uStack_338 = local_600._8_8_;
              local_330 = local_610._0_8_;
              uStack_328 = local_610._8_8_;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar60 = true, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_018b2d3f;
                fVar146 = 1.0 / fVar146;
                local_300[0] = fVar146 * (local_3c0._0_4_ + 0.0);
                local_300[1] = fVar146 * (local_3c0._4_4_ + 1.0);
                local_300[2] = fVar146 * (local_3c0._8_4_ + 2.0);
                local_300[3] = fVar146 * (local_3c0._12_4_ + 3.0);
                fStack_2f0 = fVar146 * (local_3c0._16_4_ + 4.0);
                fStack_2ec = fVar146 * (local_3c0._20_4_ + 5.0);
                fStack_2e8 = fVar146 * (local_3c0._24_4_ + 6.0);
                fStack_2e4 = local_3c0._28_4_ + 7.0;
                local_2e0 = local_3a0;
                local_2c0 = local_380;
                local_440 = 0;
                uVar61 = (ulong)((byte)uVar136 & bVar64);
                for (uVar56 = uVar61; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000)
                {
                  local_440 = local_440 + 1;
                }
                local_460 = vpbroadcastd_avx512vl();
                local_35c = iVar8;
                while( true ) {
                  auVar79 = auVar196._0_16_;
                  auVar84 = auVar189._0_16_;
                  if (uVar61 == 0) break;
                  uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_200 = local_300[local_440];
                  local_1e0 = *(undefined4 *)(local_2e0 + local_440 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + local_440 * 4);
                  local_690.context = context->user;
                  fVar169 = 1.0 - local_200;
                  fVar146 = fVar169 * fVar169 * -3.0;
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 * fVar169)),
                                            ZEXT416((uint)(local_200 * fVar169)),ZEXT416(0xc0000000)
                                           );
                  auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar169)),
                                            ZEXT416((uint)(local_200 * local_200)),
                                            ZEXT416(0x40000000));
                  fVar169 = auVar79._0_4_ * 3.0;
                  fVar172 = auVar81._0_4_ * 3.0;
                  fVar173 = local_200 * local_200 * 3.0;
                  auVar160._0_4_ = fVar173 * (float)local_470._0_4_;
                  auVar160._4_4_ = fVar173 * (float)local_470._4_4_;
                  auVar160._8_4_ = fVar173 * fStack_468;
                  auVar160._12_4_ = fVar173 * fStack_464;
                  auVar132._4_4_ = fVar172;
                  auVar132._0_4_ = fVar172;
                  auVar132._8_4_ = fVar172;
                  auVar132._12_4_ = fVar172;
                  auVar79 = vfmadd132ps_fma(auVar132,auVar160,local_610);
                  auVar147._4_4_ = fVar169;
                  auVar147._0_4_ = fVar169;
                  auVar147._8_4_ = fVar169;
                  auVar147._12_4_ = fVar169;
                  auVar79 = vfmadd132ps_fma(auVar147,auVar79,local_600);
                  auVar133._4_4_ = fVar146;
                  auVar133._0_4_ = fVar146;
                  auVar133._8_4_ = fVar146;
                  auVar133._12_4_ = fVar146;
                  auVar79 = vfmadd132ps_fma(auVar133,auVar79,local_5f0);
                  local_260 = auVar79._0_4_;
                  auVar154._8_4_ = 1;
                  auVar154._0_8_ = 0x100000001;
                  auVar154._12_4_ = 1;
                  auVar154._16_4_ = 1;
                  auVar154._20_4_ = 1;
                  auVar154._24_4_ = 1;
                  auVar154._28_4_ = 1;
                  local_240 = vpermps_avx2(auVar154,ZEXT1632(auVar79));
                  auVar162._8_4_ = 2;
                  auVar162._0_8_ = 0x200000002;
                  auVar162._12_4_ = 2;
                  auVar162._16_4_ = 2;
                  auVar162._20_4_ = 2;
                  auVar162._24_4_ = 2;
                  auVar162._28_4_ = 2;
                  local_220 = vpermps_avx2(auVar162,ZEXT1632(auVar79));
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  fStack_1fc = local_200;
                  fStack_1f8 = local_200;
                  fStack_1f4 = local_200;
                  fStack_1f0 = local_200;
                  fStack_1ec = local_200;
                  fStack_1e8 = local_200;
                  fStack_1e4 = local_200;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_280._0_8_;
                  uStack_1b8 = local_280._8_8_;
                  uStack_1b0 = local_280._16_8_;
                  uStack_1a8 = local_280._24_8_;
                  local_1a0 = local_460;
                  vpcmpeqd_avx2(local_460,local_460);
                  local_180 = (local_690.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_690.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_560 = local_2a0;
                  local_690.valid = (int *)local_560;
                  local_690.geometryUserPtr = pGVar9->userPtr;
                  local_690.hit = (RTCHitN *)&local_260;
                  local_690.N = 8;
                  local_420 = (uint)uVar61;
                  uStack_41c = (uint)(uVar61 >> 0x20);
                  local_690.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&local_690);
                    uVar61 = CONCAT44(uStack_41c,local_420);
                    auVar196 = ZEXT1664(local_4a0._0_16_);
                    auVar195 = ZEXT3264(local_5e0);
                    auVar193 = ZEXT3264(local_5c0);
                    auVar194 = ZEXT3264(local_500);
                    auVar192 = ZEXT3264(local_5a0);
                    auVar186 = ZEXT3264(local_660);
                    auVar187 = ZEXT3264(local_640);
                    auVar191 = ZEXT3264(local_4c0);
                    auVar190 = ZEXT3264(local_4e0);
                    auVar79 = vxorps_avx512vl(auVar84,auVar84);
                    auVar189 = ZEXT1664(auVar79);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar188 = ZEXT3264(auVar99);
                    uVar170 = local_520._0_4_;
                  }
                  auVar79 = auVar189._0_16_;
                  if (local_560 != (undefined1  [32])0x0) {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_690);
                      uVar61 = CONCAT44(uStack_41c,local_420);
                      auVar196 = ZEXT1664(local_4a0._0_16_);
                      auVar195 = ZEXT3264(local_5e0);
                      auVar193 = ZEXT3264(local_5c0);
                      auVar194 = ZEXT3264(local_500);
                      auVar192 = ZEXT3264(local_5a0);
                      auVar186 = ZEXT3264(local_660);
                      auVar187 = ZEXT3264(local_640);
                      auVar191 = ZEXT3264(local_4c0);
                      auVar190 = ZEXT3264(local_4e0);
                      auVar79 = vxorps_avx512vl(auVar79,auVar79);
                      auVar189 = ZEXT1664(auVar79);
                      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar188 = ZEXT3264(auVar99);
                      uVar170 = local_520._0_4_;
                    }
                    auVar79 = auVar196._0_16_;
                    uVar56 = vptestmd_avx512vl(local_560,local_560);
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar60 = (bool)((byte)uVar56 & 1);
                    auVar110._0_4_ =
                         (uint)bVar60 * auVar99._0_4_ |
                         (uint)!bVar60 * *(int *)(local_690.ray + 0x100);
                    bVar60 = (bool)((byte)(uVar56 >> 1) & 1);
                    auVar110._4_4_ =
                         (uint)bVar60 * auVar99._4_4_ |
                         (uint)!bVar60 * *(int *)(local_690.ray + 0x104);
                    bVar60 = (bool)((byte)(uVar56 >> 2) & 1);
                    auVar110._8_4_ =
                         (uint)bVar60 * auVar99._8_4_ |
                         (uint)!bVar60 * *(int *)(local_690.ray + 0x108);
                    bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
                    auVar110._12_4_ =
                         (uint)bVar60 * auVar99._12_4_ |
                         (uint)!bVar60 * *(int *)(local_690.ray + 0x10c);
                    bVar60 = (bool)((byte)(uVar56 >> 4) & 1);
                    auVar110._16_4_ =
                         (uint)bVar60 * auVar99._16_4_ |
                         (uint)!bVar60 * *(int *)(local_690.ray + 0x110);
                    bVar60 = (bool)((byte)(uVar56 >> 5) & 1);
                    auVar110._20_4_ =
                         (uint)bVar60 * auVar99._20_4_ |
                         (uint)!bVar60 * *(int *)(local_690.ray + 0x114);
                    bVar60 = (bool)((byte)(uVar56 >> 6) & 1);
                    auVar110._24_4_ =
                         (uint)bVar60 * auVar99._24_4_ |
                         (uint)!bVar60 * *(int *)(local_690.ray + 0x118);
                    bVar60 = SUB81(uVar56 >> 7,0);
                    auVar110._28_4_ =
                         (uint)bVar60 * auVar99._28_4_ |
                         (uint)!bVar60 * *(int *)(local_690.ray + 0x11c);
                    *(undefined1 (*) [32])(local_690.ray + 0x100) = auVar110;
                    if (local_560 != (undefined1  [32])0x0) {
                      bVar60 = true;
                      goto LAB_018b2d3f;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar130;
                  uVar56 = local_440 & 0x3f;
                  local_440 = 0;
                  uVar61 = uVar61 ^ 1L << uVar56;
                  for (uVar56 = uVar61; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000
                      ) {
                    local_440 = local_440 + 1;
                  }
                }
              }
            }
          }
        }
        bVar60 = false;
      }
    }
LAB_018b2d3f:
    if (8 < iVar8) {
      local_4a0 = vpbroadcastd_avx512vl();
      local_520 = vbroadcastss_avx512vl(auVar79);
      fStack_438 = 1.0 / (float)local_400._0_4_;
      local_400 = vpbroadcastd_avx512vl();
      fStack_434 = fStack_438;
      fStack_430 = fStack_438;
      fStack_42c = fStack_438;
      fStack_428 = fStack_438;
      fStack_424 = fStack_438;
      local_420 = uVar170;
      uStack_41c = uVar170;
      uStack_418 = uVar170;
      uStack_414 = uVar170;
      uStack_410 = uVar170;
      uStack_40c = uVar170;
      uStack_408 = uVar170;
      uStack_404 = uVar170;
      local_440._0_4_ = fStack_438;
      local_440._4_4_ = fStack_438;
      for (lVar63 = 8; lVar63 < iVar8; lVar63 = lVar63 + 8) {
        auVar99 = vpbroadcastd_avx512vl();
        auVar85 = vpor_avx2(auVar99,_DAT_01fb4ba0);
        uVar24 = vpcmpd_avx512vl(auVar85,local_4a0,1);
        auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 * 4 + lVar57);
        auVar100 = *(undefined1 (*) [32])(lVar57 + 0x21fb768 + lVar63 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar57 + 0x21fbbec + lVar63 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar57 + 0x21fc070 + lVar63 * 4);
        local_5c0 = auVar193._0_32_;
        auVar86 = vmulps_avx512vl(local_5c0,auVar97);
        local_5e0 = auVar195._0_32_;
        auVar96 = vmulps_avx512vl(local_5e0,auVar97);
        auVar36._4_4_ = auVar97._4_4_ * (float)local_e0._4_4_;
        auVar36._0_4_ = auVar97._0_4_ * (float)local_e0._0_4_;
        auVar36._8_4_ = auVar97._8_4_ * fStack_d8;
        auVar36._12_4_ = auVar97._12_4_ * fStack_d4;
        auVar36._16_4_ = auVar97._16_4_ * fStack_d0;
        auVar36._20_4_ = auVar97._20_4_ * fStack_cc;
        auVar36._24_4_ = auVar97._24_4_ * fStack_c8;
        auVar36._28_4_ = auVar85._28_4_;
        local_5a0 = auVar192._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar86,auVar98,local_5a0);
        auVar104 = auVar194._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar104);
        auVar96 = vfmadd231ps_avx512vl(auVar36,auVar98,local_c0);
        auVar102 = auVar187._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,auVar102);
        auVar101 = auVar186._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar100,auVar101);
        auVar79 = vfmadd231ps_fma(auVar96,auVar100,local_a0);
        auVar103 = auVar190._0_32_;
        auVar89 = vfmadd231ps_avx512vl(auVar85,auVar99,auVar103);
        local_4c0 = auVar191._0_32_;
        auVar90 = vfmadd231ps_avx512vl(auVar86,auVar99,local_4c0);
        auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 * 4 + lVar57);
        auVar86 = *(undefined1 (*) [32])(lVar57 + 0x21fdb88 + lVar63 * 4);
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar99,local_80);
        auVar96 = *(undefined1 (*) [32])(lVar57 + 0x21fe00c + lVar63 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar57 + 0x21fe490 + lVar63 * 4);
        auVar87 = vmulps_avx512vl(local_5c0,auVar95);
        auVar88 = vmulps_avx512vl(local_5e0,auVar95);
        auVar37._4_4_ = auVar95._4_4_ * (float)local_e0._4_4_;
        auVar37._0_4_ = auVar95._0_4_ * (float)local_e0._0_4_;
        auVar37._8_4_ = auVar95._8_4_ * fStack_d8;
        auVar37._12_4_ = auVar95._12_4_ * fStack_d4;
        auVar37._16_4_ = auVar95._16_4_ * fStack_d0;
        auVar37._20_4_ = auVar95._20_4_ * fStack_cc;
        auVar37._24_4_ = auVar95._24_4_ * fStack_c8;
        auVar37._28_4_ = uStack_c4;
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar96,local_5a0);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar96,auVar104);
        auVar91 = vfmadd231ps_avx512vl(auVar37,auVar96,local_c0);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar102);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar101);
        auVar84 = vfmadd231ps_fma(auVar91,auVar86,local_a0);
        auVar91 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar103);
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar85,local_4c0);
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar85,local_80);
        auVar93 = vmaxps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar84));
        auVar87 = vsubps_avx(auVar91,auVar89);
        auVar88 = vsubps_avx(auVar92,auVar90);
        auVar94 = vmulps_avx512vl(auVar90,auVar87);
        auVar111 = vmulps_avx512vl(auVar89,auVar88);
        auVar94 = vsubps_avx512vl(auVar94,auVar111);
        auVar111 = vmulps_avx512vl(auVar88,auVar88);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar87,auVar87);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        auVar93 = vmulps_avx512vl(auVar93,auVar111);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        uVar136 = vcmpps_avx512vl(auVar94,auVar93,2);
        bVar64 = (byte)uVar24 & (byte)uVar136;
        if (bVar64 == 0) {
          auVar187 = ZEXT3264(auVar102);
          auVar186 = ZEXT3264(auVar101);
        }
        else {
          auVar95 = vmulps_avx512vl(local_580,auVar95);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar95);
          auVar86 = vfmadd213ps_avx512vl(auVar86,local_120,auVar96);
          auVar85 = vfmadd213ps_avx512vl(auVar85,local_100,auVar86);
          auVar97 = vmulps_avx512vl(local_580,auVar97);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_120,auVar98);
          auVar86 = vfmadd213ps_avx512vl(auVar99,local_100,auVar100);
          auVar99 = *(undefined1 (*) [32])(lVar57 + 0x21fc4f4 + lVar63 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar57 + 0x21fc978 + lVar63 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar57 + 0x21fcdfc + lVar63 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar57 + 0x21fd280 + lVar63 * 4);
          auVar96 = vmulps_avx512vl(local_5c0,auVar97);
          auVar95 = vmulps_avx512vl(local_5e0,auVar97);
          auVar97 = vmulps_avx512vl(local_580,auVar97);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,local_5a0);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar104);
          auVar98 = vfmadd231ps_avx512vl(auVar97,local_140,auVar98);
          auVar97 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar102);
          auVar96 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar101);
          auVar100 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,auVar103);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_4c0);
          auVar95 = vfmadd231ps_avx512vl(auVar100,local_100,auVar99);
          auVar99 = *(undefined1 (*) [32])(lVar57 + 0x21fe914 + lVar63 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar57 + 0x21ff21c + lVar63 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar57 + 0x21ff6a0 + lVar63 * 4);
          auVar93 = vmulps_avx512vl(local_5c0,auVar98);
          auVar94 = vmulps_avx512vl(local_5e0,auVar98);
          auVar98 = vmulps_avx512vl(local_580,auVar98);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_5a0);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar104);
          auVar98 = vfmadd231ps_avx512vl(auVar98,local_140,auVar100);
          auVar100 = *(undefined1 (*) [32])(lVar57 + 0x21fed98 + lVar63 * 4);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar102);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar101);
          auVar100 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
          auVar98 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar103);
          auVar93 = vfmadd231ps_avx512vl(auVar94,auVar99,local_4c0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,local_100,auVar99);
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar97,auVar94);
          vandps_avx512vl(auVar96,auVar94);
          auVar99 = vmaxps_avx(auVar94,auVar94);
          vandps_avx512vl(auVar95,auVar94);
          auVar99 = vmaxps_avx(auVar99,auVar94);
          uVar56 = vcmpps_avx512vl(auVar99,local_520,1);
          bVar13 = (bool)((byte)uVar56 & 1);
          auVar112._0_4_ = (float)((uint)bVar13 * auVar87._0_4_ | (uint)!bVar13 * auVar97._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar112._4_4_ = (float)((uint)bVar13 * auVar87._4_4_ | (uint)!bVar13 * auVar97._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar112._8_4_ = (float)((uint)bVar13 * auVar87._8_4_ | (uint)!bVar13 * auVar97._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar112._12_4_ = (float)((uint)bVar13 * auVar87._12_4_ | (uint)!bVar13 * auVar97._12_4_);
          bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar112._16_4_ = (float)((uint)bVar13 * auVar87._16_4_ | (uint)!bVar13 * auVar97._16_4_);
          bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar112._20_4_ = (float)((uint)bVar13 * auVar87._20_4_ | (uint)!bVar13 * auVar97._20_4_);
          bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar112._24_4_ = (float)((uint)bVar13 * auVar87._24_4_ | (uint)!bVar13 * auVar97._24_4_);
          bVar13 = SUB81(uVar56 >> 7,0);
          auVar112._28_4_ = (uint)bVar13 * auVar87._28_4_ | (uint)!bVar13 * auVar97._28_4_;
          bVar13 = (bool)((byte)uVar56 & 1);
          auVar113._0_4_ = (float)((uint)bVar13 * auVar88._0_4_ | (uint)!bVar13 * auVar96._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar113._4_4_ = (float)((uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * auVar96._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar113._8_4_ = (float)((uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * auVar96._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar113._12_4_ = (float)((uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * auVar96._12_4_);
          bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar113._16_4_ = (float)((uint)bVar13 * auVar88._16_4_ | (uint)!bVar13 * auVar96._16_4_);
          bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar113._20_4_ = (float)((uint)bVar13 * auVar88._20_4_ | (uint)!bVar13 * auVar96._20_4_);
          bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar113._24_4_ = (float)((uint)bVar13 * auVar88._24_4_ | (uint)!bVar13 * auVar96._24_4_);
          bVar13 = SUB81(uVar56 >> 7,0);
          auVar113._28_4_ = (uint)bVar13 * auVar88._28_4_ | (uint)!bVar13 * auVar96._28_4_;
          vandps_avx512vl(auVar98,auVar94);
          vandps_avx512vl(auVar93,auVar94);
          auVar99 = vmaxps_avx(auVar113,auVar113);
          vandps_avx512vl(auVar100,auVar94);
          auVar99 = vmaxps_avx(auVar99,auVar113);
          uVar56 = vcmpps_avx512vl(auVar99,local_520,1);
          bVar13 = (bool)((byte)uVar56 & 1);
          auVar114._0_4_ = (uint)bVar13 * auVar87._0_4_ | (uint)!bVar13 * auVar98._0_4_;
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar114._4_4_ = (uint)bVar13 * auVar87._4_4_ | (uint)!bVar13 * auVar98._4_4_;
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar114._8_4_ = (uint)bVar13 * auVar87._8_4_ | (uint)!bVar13 * auVar98._8_4_;
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar114._12_4_ = (uint)bVar13 * auVar87._12_4_ | (uint)!bVar13 * auVar98._12_4_;
          bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar114._16_4_ = (uint)bVar13 * auVar87._16_4_ | (uint)!bVar13 * auVar98._16_4_;
          bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar114._20_4_ = (uint)bVar13 * auVar87._20_4_ | (uint)!bVar13 * auVar98._20_4_;
          bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar114._24_4_ = (uint)bVar13 * auVar87._24_4_ | (uint)!bVar13 * auVar98._24_4_;
          bVar13 = SUB81(uVar56 >> 7,0);
          auVar114._28_4_ = (uint)bVar13 * auVar87._28_4_ | (uint)!bVar13 * auVar98._28_4_;
          bVar13 = (bool)((byte)uVar56 & 1);
          auVar115._0_4_ = (float)((uint)bVar13 * auVar88._0_4_ | (uint)!bVar13 * auVar93._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * auVar93._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * auVar93._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * auVar93._12_4_);
          bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar13 * auVar88._16_4_ | (uint)!bVar13 * auVar93._16_4_);
          bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar13 * auVar88._20_4_ | (uint)!bVar13 * auVar93._20_4_);
          bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar13 * auVar88._24_4_ | (uint)!bVar13 * auVar93._24_4_);
          bVar13 = SUB81(uVar56 >> 7,0);
          auVar115._28_4_ = (uint)bVar13 * auVar88._28_4_ | (uint)!bVar13 * auVar93._28_4_;
          auVar175._8_4_ = 0x80000000;
          auVar175._0_8_ = 0x8000000080000000;
          auVar175._12_4_ = 0x80000000;
          auVar175._16_4_ = 0x80000000;
          auVar175._20_4_ = 0x80000000;
          auVar175._24_4_ = 0x80000000;
          auVar175._28_4_ = 0x80000000;
          auVar99 = vxorps_avx512vl(auVar114,auVar175);
          auVar93 = auVar189._0_32_;
          auVar100 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar93);
          auVar81 = vfmadd231ps_fma(auVar100,auVar113,auVar113);
          auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
          auVar185._8_4_ = 0xbf000000;
          auVar185._0_8_ = 0xbf000000bf000000;
          auVar185._12_4_ = 0xbf000000;
          auVar185._16_4_ = 0xbf000000;
          auVar185._20_4_ = 0xbf000000;
          auVar185._24_4_ = 0xbf000000;
          auVar185._28_4_ = 0xbf000000;
          fVar146 = auVar100._0_4_;
          fVar169 = auVar100._4_4_;
          fVar172 = auVar100._8_4_;
          fVar173 = auVar100._12_4_;
          fVar165 = auVar100._16_4_;
          fVar164 = auVar100._20_4_;
          fVar167 = auVar100._24_4_;
          auVar38._4_4_ = fVar169 * fVar169 * fVar169 * auVar81._4_4_ * -0.5;
          auVar38._0_4_ = fVar146 * fVar146 * fVar146 * auVar81._0_4_ * -0.5;
          auVar38._8_4_ = fVar172 * fVar172 * fVar172 * auVar81._8_4_ * -0.5;
          auVar38._12_4_ = fVar173 * fVar173 * fVar173 * auVar81._12_4_ * -0.5;
          auVar38._16_4_ = fVar165 * fVar165 * fVar165 * -0.0;
          auVar38._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
          auVar38._24_4_ = fVar167 * fVar167 * fVar167 * -0.0;
          auVar38._28_4_ = auVar113._28_4_;
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar100 = vfmadd231ps_avx512vl(auVar38,auVar98,auVar100);
          auVar39._4_4_ = auVar113._4_4_ * auVar100._4_4_;
          auVar39._0_4_ = auVar113._0_4_ * auVar100._0_4_;
          auVar39._8_4_ = auVar113._8_4_ * auVar100._8_4_;
          auVar39._12_4_ = auVar113._12_4_ * auVar100._12_4_;
          auVar39._16_4_ = auVar113._16_4_ * auVar100._16_4_;
          auVar39._20_4_ = auVar113._20_4_ * auVar100._20_4_;
          auVar39._24_4_ = auVar113._24_4_ * auVar100._24_4_;
          auVar39._28_4_ = 0;
          auVar40._4_4_ = auVar100._4_4_ * -auVar112._4_4_;
          auVar40._0_4_ = auVar100._0_4_ * -auVar112._0_4_;
          auVar40._8_4_ = auVar100._8_4_ * -auVar112._8_4_;
          auVar40._12_4_ = auVar100._12_4_ * -auVar112._12_4_;
          auVar40._16_4_ = auVar100._16_4_ * -auVar112._16_4_;
          auVar40._20_4_ = auVar100._20_4_ * -auVar112._20_4_;
          auVar40._24_4_ = auVar100._24_4_ * -auVar112._24_4_;
          auVar40._28_4_ = auVar113._28_4_;
          auVar97 = vmulps_avx512vl(auVar100,auVar93);
          auVar100 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar93);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,auVar115);
          auVar96 = vrsqrt14ps_avx512vl(auVar100);
          auVar100 = vmulps_avx512vl(auVar100,auVar185);
          fVar146 = auVar96._0_4_;
          fVar169 = auVar96._4_4_;
          fVar172 = auVar96._8_4_;
          fVar173 = auVar96._12_4_;
          fVar165 = auVar96._16_4_;
          fVar164 = auVar96._20_4_;
          fVar167 = auVar96._24_4_;
          auVar41._4_4_ = fVar169 * fVar169 * fVar169 * auVar100._4_4_;
          auVar41._0_4_ = fVar146 * fVar146 * fVar146 * auVar100._0_4_;
          auVar41._8_4_ = fVar172 * fVar172 * fVar172 * auVar100._8_4_;
          auVar41._12_4_ = fVar173 * fVar173 * fVar173 * auVar100._12_4_;
          auVar41._16_4_ = fVar165 * fVar165 * fVar165 * auVar100._16_4_;
          auVar41._20_4_ = fVar164 * fVar164 * fVar164 * auVar100._20_4_;
          auVar41._24_4_ = fVar167 * fVar167 * fVar167 * auVar100._24_4_;
          auVar41._28_4_ = auVar100._28_4_;
          auVar100 = vfmadd231ps_avx512vl(auVar41,auVar98,auVar96);
          auVar42._4_4_ = auVar115._4_4_ * auVar100._4_4_;
          auVar42._0_4_ = auVar115._0_4_ * auVar100._0_4_;
          auVar42._8_4_ = auVar115._8_4_ * auVar100._8_4_;
          auVar42._12_4_ = auVar115._12_4_ * auVar100._12_4_;
          auVar42._16_4_ = auVar115._16_4_ * auVar100._16_4_;
          auVar42._20_4_ = auVar115._20_4_ * auVar100._20_4_;
          auVar42._24_4_ = auVar115._24_4_ * auVar100._24_4_;
          auVar42._28_4_ = auVar96._28_4_;
          auVar43._4_4_ = auVar100._4_4_ * auVar99._4_4_;
          auVar43._0_4_ = auVar100._0_4_ * auVar99._0_4_;
          auVar43._8_4_ = auVar100._8_4_ * auVar99._8_4_;
          auVar43._12_4_ = auVar100._12_4_ * auVar99._12_4_;
          auVar43._16_4_ = auVar100._16_4_ * auVar99._16_4_;
          auVar43._20_4_ = auVar100._20_4_ * auVar99._20_4_;
          auVar43._24_4_ = auVar100._24_4_ * auVar99._24_4_;
          auVar43._28_4_ = auVar99._28_4_;
          auVar99 = vmulps_avx512vl(auVar100,auVar93);
          auVar81 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar79),auVar89);
          auVar100 = ZEXT1632(auVar79);
          auVar80 = vfmadd213ps_fma(auVar40,auVar100,auVar90);
          auVar98 = vfmadd213ps_avx512vl(auVar97,auVar100,auVar86);
          auVar96 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar84),auVar91);
          auVar72 = vfnmadd213ps_fma(auVar39,auVar100,auVar89);
          auVar95 = ZEXT1632(auVar84);
          auVar6 = vfmadd213ps_fma(auVar43,auVar95,auVar92);
          auVar73 = vfnmadd213ps_fma(auVar40,auVar100,auVar90);
          auVar21 = vfmadd213ps_fma(auVar99,auVar95,auVar85);
          auVar90 = ZEXT1632(auVar79);
          auVar77 = vfnmadd231ps_fma(auVar86,auVar90,auVar97);
          auVar74 = vfnmadd213ps_fma(auVar42,auVar95,auVar91);
          auVar76 = vfnmadd213ps_fma(auVar43,auVar95,auVar92);
          auVar78 = vfnmadd231ps_fma(auVar85,ZEXT1632(auVar84),auVar99);
          auVar85 = vsubps_avx512vl(auVar96,ZEXT1632(auVar72));
          auVar99 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar73));
          auVar100 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar77));
          auVar44._4_4_ = auVar99._4_4_ * auVar77._4_4_;
          auVar44._0_4_ = auVar99._0_4_ * auVar77._0_4_;
          auVar44._8_4_ = auVar99._8_4_ * auVar77._8_4_;
          auVar44._12_4_ = auVar99._12_4_ * auVar77._12_4_;
          auVar44._16_4_ = auVar99._16_4_ * 0.0;
          auVar44._20_4_ = auVar99._20_4_ * 0.0;
          auVar44._24_4_ = auVar99._24_4_ * 0.0;
          auVar44._28_4_ = auVar97._28_4_;
          auVar79 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar73),auVar100);
          auVar45._4_4_ = auVar100._4_4_ * auVar72._4_4_;
          auVar45._0_4_ = auVar100._0_4_ * auVar72._0_4_;
          auVar45._8_4_ = auVar100._8_4_ * auVar72._8_4_;
          auVar45._12_4_ = auVar100._12_4_ * auVar72._12_4_;
          auVar45._16_4_ = auVar100._16_4_ * 0.0;
          auVar45._20_4_ = auVar100._20_4_ * 0.0;
          auVar45._24_4_ = auVar100._24_4_ * 0.0;
          auVar45._28_4_ = auVar100._28_4_;
          auVar75 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar77),auVar85);
          auVar46._4_4_ = auVar73._4_4_ * auVar85._4_4_;
          auVar46._0_4_ = auVar73._0_4_ * auVar85._0_4_;
          auVar46._8_4_ = auVar73._8_4_ * auVar85._8_4_;
          auVar46._12_4_ = auVar73._12_4_ * auVar85._12_4_;
          auVar46._16_4_ = auVar85._16_4_ * 0.0;
          auVar46._20_4_ = auVar85._20_4_ * 0.0;
          auVar46._24_4_ = auVar85._24_4_ * 0.0;
          auVar46._28_4_ = auVar85._28_4_;
          auVar71 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar72),auVar99);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar93,ZEXT1632(auVar75));
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar79));
          uVar56 = vcmpps_avx512vl(auVar99,auVar93,2);
          bVar55 = (byte)uVar56;
          fVar122 = (float)((uint)(bVar55 & 1) * auVar81._0_4_ |
                           (uint)!(bool)(bVar55 & 1) * auVar74._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          fVar124 = (float)((uint)bVar13 * auVar81._4_4_ | (uint)!bVar13 * auVar74._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          fVar126 = (float)((uint)bVar13 * auVar81._8_4_ | (uint)!bVar13 * auVar74._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          fVar128 = (float)((uint)bVar13 * auVar81._12_4_ | (uint)!bVar13 * auVar74._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar122))));
          fVar123 = (float)((uint)(bVar55 & 1) * auVar80._0_4_ |
                           (uint)!(bool)(bVar55 & 1) * auVar76._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          fVar125 = (float)((uint)bVar13 * auVar80._4_4_ | (uint)!bVar13 * auVar76._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          fVar127 = (float)((uint)bVar13 * auVar80._8_4_ | (uint)!bVar13 * auVar76._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          fVar129 = (float)((uint)bVar13 * auVar80._12_4_ | (uint)!bVar13 * auVar76._12_4_);
          auVar87 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar127,CONCAT44(fVar125,fVar123))));
          auVar116._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar98._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar78._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar78._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar78._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar78._12_4_);
          fVar146 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar98._16_4_);
          auVar116._16_4_ = fVar146;
          fVar169 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar98._20_4_);
          auVar116._20_4_ = fVar169;
          fVar172 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar98._24_4_);
          auVar116._24_4_ = fVar172;
          iVar1 = (uint)(byte)(uVar56 >> 7) * auVar98._28_4_;
          auVar116._28_4_ = iVar1;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar72),auVar96);
          auVar117._0_4_ =
               (uint)(bVar55 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar79._0_4_;
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar117._4_4_ = (uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar79._4_4_;
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar117._8_4_ = (uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar79._8_4_;
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar117._12_4_ = (uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar79._12_4_;
          auVar117._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar99._16_4_;
          auVar117._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar99._20_4_;
          auVar117._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar99._24_4_;
          auVar117._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar6));
          auVar118._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar81._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar81._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar81._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar81._12_4_);
          fVar165 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar99._16_4_);
          auVar118._16_4_ = fVar165;
          fVar173 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar99._20_4_);
          auVar118._20_4_ = fVar173;
          fVar164 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar99._24_4_);
          auVar118._24_4_ = fVar164;
          auVar118._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar21));
          auVar119._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar80._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar80._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar80._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar80._12_4_);
          fVar65 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar99._16_4_);
          auVar119._16_4_ = fVar65;
          fVar167 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar99._20_4_);
          auVar119._20_4_ = fVar167;
          fVar66 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar99._24_4_);
          auVar119._24_4_ = fVar66;
          iVar2 = (uint)(byte)(uVar56 >> 7) * auVar99._28_4_;
          auVar119._28_4_ = iVar2;
          auVar120._0_4_ =
               (uint)(bVar55 & 1) * (int)auVar72._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar96._0_4_;
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar13 * (int)auVar72._4_4_ | (uint)!bVar13 * auVar96._4_4_;
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar13 * (int)auVar72._8_4_ | (uint)!bVar13 * auVar96._8_4_;
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar13 * (int)auVar72._12_4_ | (uint)!bVar13 * auVar96._12_4_;
          auVar120._16_4_ = (uint)!(bool)((byte)(uVar56 >> 4) & 1) * auVar96._16_4_;
          auVar120._20_4_ = (uint)!(bool)((byte)(uVar56 >> 5) & 1) * auVar96._20_4_;
          auVar120._24_4_ = (uint)!(bool)((byte)(uVar56 >> 6) & 1) * auVar96._24_4_;
          auVar120._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar96._28_4_;
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar56 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar56 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar56 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar56 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar96 = vsubps_avx512vl(auVar120,auVar95);
          auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar73._12_4_ |
                                                   (uint)!bVar17 * auVar6._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar73._8_4_ |
                                                            (uint)!bVar16 * auVar6._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar73._4_4_ |
                                                                     (uint)!bVar13 * auVar6._4_4_,
                                                                     (uint)(bVar55 & 1) *
                                                                     (int)auVar73._0_4_ |
                                                                     (uint)!(bool)(bVar55 & 1) *
                                                                     auVar6._0_4_)))),auVar87);
          auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar77._12_4_ |
                                                  (uint)!bVar18 * auVar21._12_4_,
                                                  CONCAT48((uint)bVar15 * (int)auVar77._8_4_ |
                                                           (uint)!bVar15 * auVar21._8_4_,
                                                           CONCAT44((uint)bVar14 *
                                                                    (int)auVar77._4_4_ |
                                                                    (uint)!bVar14 * auVar21._4_4_,
                                                                    (uint)(bVar55 & 1) *
                                                                    (int)auVar77._0_4_ |
                                                                    (uint)!(bool)(bVar55 & 1) *
                                                                    auVar21._0_4_)))),auVar116);
          auVar97 = vsubps_avx(auVar95,auVar117);
          auVar85 = vsubps_avx(auVar87,auVar118);
          auVar86 = vsubps_avx(auVar116,auVar119);
          auVar47._4_4_ = auVar98._4_4_ * fVar124;
          auVar47._0_4_ = auVar98._0_4_ * fVar122;
          auVar47._8_4_ = auVar98._8_4_ * fVar126;
          auVar47._12_4_ = auVar98._12_4_ * fVar128;
          auVar47._16_4_ = auVar98._16_4_ * 0.0;
          auVar47._20_4_ = auVar98._20_4_ * 0.0;
          auVar47._24_4_ = auVar98._24_4_ * 0.0;
          auVar47._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar47,auVar116,auVar96);
          auVar150._0_4_ = fVar123 * auVar96._0_4_;
          auVar150._4_4_ = fVar125 * auVar96._4_4_;
          auVar150._8_4_ = fVar127 * auVar96._8_4_;
          auVar150._12_4_ = fVar129 * auVar96._12_4_;
          auVar150._16_4_ = auVar96._16_4_ * 0.0;
          auVar150._20_4_ = auVar96._20_4_ * 0.0;
          auVar150._24_4_ = auVar96._24_4_ * 0.0;
          auVar150._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar150,auVar95,auVar100);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar93,ZEXT1632(auVar79));
          auVar155._0_4_ = auVar100._0_4_ * auVar116._0_4_;
          auVar155._4_4_ = auVar100._4_4_ * auVar116._4_4_;
          auVar155._8_4_ = auVar100._8_4_ * auVar116._8_4_;
          auVar155._12_4_ = auVar100._12_4_ * auVar116._12_4_;
          auVar155._16_4_ = auVar100._16_4_ * fVar146;
          auVar155._20_4_ = auVar100._20_4_ * fVar169;
          auVar155._24_4_ = auVar100._24_4_ * fVar172;
          auVar155._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar155,auVar87,auVar98);
          auVar88 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar79));
          auVar99 = vmulps_avx512vl(auVar86,auVar117);
          auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar119);
          auVar48._4_4_ = auVar85._4_4_ * auVar119._4_4_;
          auVar48._0_4_ = auVar85._0_4_ * auVar119._0_4_;
          auVar48._8_4_ = auVar85._8_4_ * auVar119._8_4_;
          auVar48._12_4_ = auVar85._12_4_ * auVar119._12_4_;
          auVar48._16_4_ = auVar85._16_4_ * fVar65;
          auVar48._20_4_ = auVar85._20_4_ * fVar167;
          auVar48._24_4_ = auVar85._24_4_ * fVar66;
          auVar48._28_4_ = iVar2;
          auVar79 = vfmsub231ps_fma(auVar48,auVar118,auVar86);
          auVar156._0_4_ = auVar118._0_4_ * auVar97._0_4_;
          auVar156._4_4_ = auVar118._4_4_ * auVar97._4_4_;
          auVar156._8_4_ = auVar118._8_4_ * auVar97._8_4_;
          auVar156._12_4_ = auVar118._12_4_ * auVar97._12_4_;
          auVar156._16_4_ = fVar165 * auVar97._16_4_;
          auVar156._20_4_ = fVar173 * auVar97._20_4_;
          auVar156._24_4_ = fVar164 * auVar97._24_4_;
          auVar156._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar156,auVar85,auVar117);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar93,auVar99);
          auVar89 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar79));
          auVar99 = vmaxps_avx(auVar88,auVar89);
          uVar136 = vcmpps_avx512vl(auVar99,auVar93,2);
          bVar64 = bVar64 & (byte)uVar136;
          if (bVar64 != 0) {
            auVar49._4_4_ = auVar86._4_4_ * auVar100._4_4_;
            auVar49._0_4_ = auVar86._0_4_ * auVar100._0_4_;
            auVar49._8_4_ = auVar86._8_4_ * auVar100._8_4_;
            auVar49._12_4_ = auVar86._12_4_ * auVar100._12_4_;
            auVar49._16_4_ = auVar86._16_4_ * auVar100._16_4_;
            auVar49._20_4_ = auVar86._20_4_ * auVar100._20_4_;
            auVar49._24_4_ = auVar86._24_4_ * auVar100._24_4_;
            auVar49._28_4_ = auVar99._28_4_;
            auVar80 = vfmsub231ps_fma(auVar49,auVar85,auVar98);
            auVar50._4_4_ = auVar98._4_4_ * auVar97._4_4_;
            auVar50._0_4_ = auVar98._0_4_ * auVar97._0_4_;
            auVar50._8_4_ = auVar98._8_4_ * auVar97._8_4_;
            auVar50._12_4_ = auVar98._12_4_ * auVar97._12_4_;
            auVar50._16_4_ = auVar98._16_4_ * auVar97._16_4_;
            auVar50._20_4_ = auVar98._20_4_ * auVar97._20_4_;
            auVar50._24_4_ = auVar98._24_4_ * auVar97._24_4_;
            auVar50._28_4_ = auVar98._28_4_;
            auVar81 = vfmsub231ps_fma(auVar50,auVar96,auVar86);
            auVar51._4_4_ = auVar85._4_4_ * auVar96._4_4_;
            auVar51._0_4_ = auVar85._0_4_ * auVar96._0_4_;
            auVar51._8_4_ = auVar85._8_4_ * auVar96._8_4_;
            auVar51._12_4_ = auVar85._12_4_ * auVar96._12_4_;
            auVar51._16_4_ = auVar85._16_4_ * auVar96._16_4_;
            auVar51._20_4_ = auVar85._20_4_ * auVar96._20_4_;
            auVar51._24_4_ = auVar85._24_4_ * auVar96._24_4_;
            auVar51._28_4_ = auVar85._28_4_;
            auVar6 = vfmsub231ps_fma(auVar51,auVar97,auVar100);
            auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar6));
            auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar80),auVar93);
            auVar100 = vrcp14ps_avx512vl(auVar99);
            auVar97 = auVar188._0_32_;
            auVar98 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar97);
            auVar79 = vfmadd132ps_fma(auVar98,auVar100,auVar100);
            auVar52._4_4_ = auVar6._4_4_ * auVar116._4_4_;
            auVar52._0_4_ = auVar6._0_4_ * auVar116._0_4_;
            auVar52._8_4_ = auVar6._8_4_ * auVar116._8_4_;
            auVar52._12_4_ = auVar6._12_4_ * auVar116._12_4_;
            auVar52._16_4_ = fVar146 * 0.0;
            auVar52._20_4_ = fVar169 * 0.0;
            auVar52._24_4_ = fVar172 * 0.0;
            auVar52._28_4_ = iVar1;
            auVar81 = vfmadd231ps_fma(auVar52,auVar87,ZEXT1632(auVar81));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar95,ZEXT1632(auVar80));
            fVar146 = auVar79._0_4_;
            fVar169 = auVar79._4_4_;
            fVar172 = auVar79._8_4_;
            fVar173 = auVar79._12_4_;
            local_380 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar173,
                                           CONCAT48(auVar81._8_4_ * fVar172,
                                                    CONCAT44(auVar81._4_4_ * fVar169,
                                                             auVar81._0_4_ * fVar146))));
            auVar54._4_4_ = uStack_41c;
            auVar54._0_4_ = local_420;
            auVar54._8_4_ = uStack_418;
            auVar54._12_4_ = uStack_414;
            auVar54._16_4_ = uStack_410;
            auVar54._20_4_ = uStack_40c;
            auVar54._24_4_ = uStack_408;
            auVar54._28_4_ = uStack_404;
            uVar136 = vcmpps_avx512vl(local_380,auVar54,0xd);
            uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar28._4_4_ = uVar130;
            auVar28._0_4_ = uVar130;
            auVar28._8_4_ = uVar130;
            auVar28._12_4_ = uVar130;
            auVar28._16_4_ = uVar130;
            auVar28._20_4_ = uVar130;
            auVar28._24_4_ = uVar130;
            auVar28._28_4_ = uVar130;
            uVar24 = vcmpps_avx512vl(local_380,auVar28,2);
            bVar64 = (byte)uVar136 & (byte)uVar24 & bVar64;
            if (bVar64 != 0) {
              uVar136 = vcmpps_avx512vl(auVar99,auVar93,4);
              bVar64 = bVar64 & (byte)uVar136;
              auVar187 = ZEXT3264(local_640);
              auVar186 = ZEXT3264(local_660);
              if (bVar64 != 0) {
                fVar165 = auVar88._0_4_ * fVar146;
                fVar164 = auVar88._4_4_ * fVar169;
                auVar53._4_4_ = fVar164;
                auVar53._0_4_ = fVar165;
                fVar167 = auVar88._8_4_ * fVar172;
                auVar53._8_4_ = fVar167;
                fVar65 = auVar88._12_4_ * fVar173;
                auVar53._12_4_ = fVar65;
                fVar66 = auVar88._16_4_ * 0.0;
                auVar53._16_4_ = fVar66;
                fVar122 = auVar88._20_4_ * 0.0;
                auVar53._20_4_ = fVar122;
                fVar123 = auVar88._24_4_ * 0.0;
                auVar53._24_4_ = fVar123;
                auVar53._28_4_ = auVar99._28_4_;
                auVar100 = vsubps_avx512vl(auVar97,auVar53);
                local_3c0._0_4_ =
                     (float)((uint)(bVar55 & 1) * (int)fVar165 |
                            (uint)!(bool)(bVar55 & 1) * auVar100._0_4_);
                bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
                local_3c0._4_4_ =
                     (float)((uint)bVar13 * (int)fVar164 | (uint)!bVar13 * auVar100._4_4_);
                bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
                local_3c0._8_4_ =
                     (float)((uint)bVar13 * (int)fVar167 | (uint)!bVar13 * auVar100._8_4_);
                bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
                local_3c0._12_4_ =
                     (float)((uint)bVar13 * (int)fVar65 | (uint)!bVar13 * auVar100._12_4_);
                bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
                local_3c0._16_4_ =
                     (float)((uint)bVar13 * (int)fVar66 | (uint)!bVar13 * auVar100._16_4_);
                bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
                local_3c0._20_4_ =
                     (float)((uint)bVar13 * (int)fVar122 | (uint)!bVar13 * auVar100._20_4_);
                bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
                local_3c0._24_4_ =
                     (float)((uint)bVar13 * (int)fVar123 | (uint)!bVar13 * auVar100._24_4_);
                bVar13 = SUB81(uVar56 >> 7,0);
                local_3c0._28_4_ =
                     (float)((uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar100._28_4_);
                auVar99 = vsubps_avx(ZEXT1632(auVar84),auVar90);
                auVar79 = vfmadd213ps_fma(auVar99,local_3c0,auVar90);
                uVar130 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar29._4_4_ = uVar130;
                auVar29._0_4_ = uVar130;
                auVar29._8_4_ = uVar130;
                auVar29._12_4_ = uVar130;
                auVar29._16_4_ = uVar130;
                auVar29._20_4_ = uVar130;
                auVar29._24_4_ = uVar130;
                auVar29._28_4_ = uVar130;
                auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                             CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                                                      CONCAT44(auVar79._4_4_ +
                                                                               auVar79._4_4_,
                                                                               auVar79._0_4_ +
                                                                               auVar79._0_4_)))),
                                          auVar29);
                uVar136 = vcmpps_avx512vl(local_380,auVar99,6);
                if (((byte)uVar136 & bVar64) != 0) {
                  auVar141._0_4_ = auVar89._0_4_ * fVar146;
                  auVar141._4_4_ = auVar89._4_4_ * fVar169;
                  auVar141._8_4_ = auVar89._8_4_ * fVar172;
                  auVar141._12_4_ = auVar89._12_4_ * fVar173;
                  auVar141._16_4_ = auVar89._16_4_ * 0.0;
                  auVar141._20_4_ = auVar89._20_4_ * 0.0;
                  auVar141._24_4_ = auVar89._24_4_ * 0.0;
                  auVar141._28_4_ = 0;
                  auVar99 = vsubps_avx512vl(auVar97,auVar141);
                  auVar121._0_4_ =
                       (uint)(bVar55 & 1) * (int)auVar141._0_4_ |
                       (uint)!(bool)(bVar55 & 1) * auVar99._0_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
                  auVar121._4_4_ =
                       (uint)bVar13 * (int)auVar141._4_4_ | (uint)!bVar13 * auVar99._4_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
                  auVar121._8_4_ =
                       (uint)bVar13 * (int)auVar141._8_4_ | (uint)!bVar13 * auVar99._8_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
                  auVar121._12_4_ =
                       (uint)bVar13 * (int)auVar141._12_4_ | (uint)!bVar13 * auVar99._12_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
                  auVar121._16_4_ =
                       (uint)bVar13 * (int)auVar141._16_4_ | (uint)!bVar13 * auVar99._16_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
                  auVar121._20_4_ =
                       (uint)bVar13 * (int)auVar141._20_4_ | (uint)!bVar13 * auVar99._20_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
                  auVar121._24_4_ =
                       (uint)bVar13 * (int)auVar141._24_4_ | (uint)!bVar13 * auVar99._24_4_;
                  auVar121._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar99._28_4_;
                  auVar30._8_4_ = 0x40000000;
                  auVar30._0_8_ = 0x4000000040000000;
                  auVar30._12_4_ = 0x40000000;
                  auVar30._16_4_ = 0x40000000;
                  auVar30._20_4_ = 0x40000000;
                  auVar30._24_4_ = 0x40000000;
                  auVar30._28_4_ = 0x40000000;
                  local_3a0 = vfmsub132ps_avx512vl(auVar121,auVar97,auVar30);
                  local_360 = (undefined4)lVar63;
                  local_350 = local_5f0._0_8_;
                  uStack_348 = local_5f0._8_8_;
                  local_340 = local_600._0_8_;
                  uStack_338 = local_600._8_8_;
                  local_330 = local_610._0_8_;
                  uStack_328 = local_610._8_8_;
                  pGVar9 = (context->scene->geometries).items[uVar7].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    bVar55 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar55 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar79 = vcvtsi2ss_avx512f(auVar188._0_16_,local_360);
                    fVar146 = auVar79._0_4_;
                    local_300[0] = (fVar146 + local_3c0._0_4_ + 0.0) * (float)local_440;
                    local_300[1] = (fVar146 + local_3c0._4_4_ + 1.0) * local_440._4_4_;
                    local_300[2] = (fVar146 + local_3c0._8_4_ + 2.0) * fStack_438;
                    local_300[3] = (fVar146 + local_3c0._12_4_ + 3.0) * fStack_434;
                    fStack_2f0 = (fVar146 + local_3c0._16_4_ + 4.0) * fStack_430;
                    fStack_2ec = (fVar146 + local_3c0._20_4_ + 5.0) * fStack_42c;
                    fStack_2e8 = (fVar146 + local_3c0._24_4_ + 6.0) * fStack_428;
                    fStack_2e4 = fVar146 + local_3c0._28_4_ + 7.0;
                    local_2e0 = local_3a0;
                    local_2c0 = local_380;
                    uVar56 = 0;
                    uVar58 = (ulong)((byte)uVar136 & bVar64);
                    for (uVar61 = uVar58; local_35c = iVar8, (uVar61 & 1) == 0;
                        uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                      uVar56 = uVar56 + 1;
                    }
                    while (auVar79 = auVar189._0_16_, uVar58 != 0) {
                      uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_200 = local_300[uVar56];
                      local_1e0 = *(undefined4 *)(local_2e0 + uVar56 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar56 * 4)
                      ;
                      local_690.context = context->user;
                      fVar169 = 1.0 - local_200;
                      fVar146 = fVar169 * fVar169 * -3.0;
                      auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar169 * fVar169)),
                                                ZEXT416((uint)(local_200 * fVar169)),
                                                ZEXT416(0xc0000000));
                      auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar169)),
                                                ZEXT416((uint)(local_200 * local_200)),
                                                ZEXT416(0x40000000));
                      fVar169 = auVar79._0_4_ * 3.0;
                      fVar172 = auVar84._0_4_ * 3.0;
                      fVar173 = local_200 * local_200 * 3.0;
                      auVar161._0_4_ = fVar173 * (float)local_470._0_4_;
                      auVar161._4_4_ = fVar173 * (float)local_470._4_4_;
                      auVar161._8_4_ = fVar173 * fStack_468;
                      auVar161._12_4_ = fVar173 * fStack_464;
                      auVar134._4_4_ = fVar172;
                      auVar134._0_4_ = fVar172;
                      auVar134._8_4_ = fVar172;
                      auVar134._12_4_ = fVar172;
                      auVar79 = vfmadd132ps_fma(auVar134,auVar161,local_610);
                      auVar148._4_4_ = fVar169;
                      auVar148._0_4_ = fVar169;
                      auVar148._8_4_ = fVar169;
                      auVar148._12_4_ = fVar169;
                      auVar79 = vfmadd132ps_fma(auVar148,auVar79,local_600);
                      auVar135._4_4_ = fVar146;
                      auVar135._0_4_ = fVar146;
                      auVar135._8_4_ = fVar146;
                      auVar135._12_4_ = fVar146;
                      auVar79 = vfmadd132ps_fma(auVar135,auVar79,local_5f0);
                      local_260 = auVar79._0_4_;
                      auVar157._8_4_ = 1;
                      auVar157._0_8_ = 0x100000001;
                      auVar157._12_4_ = 1;
                      auVar157._16_4_ = 1;
                      auVar157._20_4_ = 1;
                      auVar157._24_4_ = 1;
                      auVar157._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar157,ZEXT1632(auVar79));
                      auVar163._8_4_ = 2;
                      auVar163._0_8_ = 0x200000002;
                      auVar163._12_4_ = 2;
                      auVar163._16_4_ = 2;
                      auVar163._20_4_ = 2;
                      auVar163._24_4_ = 2;
                      auVar163._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar163,ZEXT1632(auVar79));
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_280._0_8_;
                      uStack_1b8 = local_280._8_8_;
                      uStack_1b0 = local_280._16_8_;
                      uStack_1a8 = local_280._24_8_;
                      local_1a0 = local_400;
                      vpcmpeqd_avx2(local_400,local_400);
                      local_180 = (local_690.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_690.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_560 = local_2a0;
                      local_690.valid = (int *)local_560;
                      local_690.geometryUserPtr = pGVar9->userPtr;
                      local_690.hit = (RTCHitN *)&local_260;
                      local_690.N = 8;
                      local_460._0_8_ = uVar56;
                      uVar61 = uVar56;
                      local_690.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->occlusionFilterN)(&local_690);
                        uVar61 = local_460._0_8_;
                      }
                      if (local_560 != (undefined1  [32])0x0) {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_690);
                          uVar61 = local_460._0_8_;
                        }
                        auVar79 = auVar189._0_16_;
                        uVar56 = vptestmd_avx512vl(local_560,local_560);
                        auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar13 = (bool)((byte)uVar56 & 1);
                        bVar14 = (bool)((byte)(uVar56 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar56 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar56 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar56 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar56 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar56 >> 6) & 1);
                        bVar20 = SUB81(uVar56 >> 7,0);
                        *(uint *)(local_690.ray + 0x100) =
                             (uint)bVar13 * auVar99._0_4_ |
                             (uint)!bVar13 * *(int *)(local_690.ray + 0x100);
                        *(uint *)(local_690.ray + 0x104) =
                             (uint)bVar14 * auVar99._4_4_ |
                             (uint)!bVar14 * *(int *)(local_690.ray + 0x104);
                        *(uint *)(local_690.ray + 0x108) =
                             (uint)bVar16 * auVar99._8_4_ |
                             (uint)!bVar16 * *(int *)(local_690.ray + 0x108);
                        *(uint *)(local_690.ray + 0x10c) =
                             (uint)bVar15 * auVar99._12_4_ |
                             (uint)!bVar15 * *(int *)(local_690.ray + 0x10c);
                        *(uint *)(local_690.ray + 0x110) =
                             (uint)bVar17 * auVar99._16_4_ |
                             (uint)!bVar17 * *(int *)(local_690.ray + 0x110);
                        *(uint *)(local_690.ray + 0x114) =
                             (uint)bVar18 * auVar99._20_4_ |
                             (uint)!bVar18 * *(int *)(local_690.ray + 0x114);
                        *(uint *)(local_690.ray + 0x118) =
                             (uint)bVar19 * auVar99._24_4_ |
                             (uint)!bVar19 * *(int *)(local_690.ray + 0x118);
                        *(uint *)(local_690.ray + 0x11c) =
                             (uint)bVar20 * auVar99._28_4_ |
                             (uint)!bVar20 * *(int *)(local_690.ray + 0x11c);
                        if (local_560 != (undefined1  [32])0x0) {
                          bVar55 = 1;
                          goto LAB_018b37af;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar130;
                      uVar56 = 0;
                      uVar58 = uVar58 ^ 1L << (uVar61 & 0x3f);
                      for (uVar61 = uVar58; (uVar61 & 1) == 0;
                          uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                        uVar56 = uVar56 + 1;
                      }
                    }
                    bVar55 = 0;
LAB_018b37af:
                    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar188 = ZEXT3264(auVar99);
                    auVar79 = vxorps_avx512vl(auVar79,auVar79);
                    auVar189 = ZEXT1664(auVar79);
                    auVar190 = ZEXT3264(local_4e0);
                    auVar191 = ZEXT3264(local_4c0);
                    auVar187 = ZEXT3264(local_640);
                    auVar186 = ZEXT3264(local_660);
                    auVar192 = ZEXT3264(local_5a0);
                    auVar194 = ZEXT3264(local_500);
                    auVar193 = ZEXT3264(local_5c0);
                    auVar195 = ZEXT3264(local_5e0);
                  }
                  bVar60 = (bool)(bVar60 | bVar55);
                }
              }
              goto LAB_018b378e;
            }
          }
          auVar187 = ZEXT3264(local_640);
          auVar186 = ZEXT3264(local_660);
        }
LAB_018b378e:
      }
    }
    if (bVar60) break;
    uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar25._4_4_ = uVar130;
    auVar25._0_4_ = uVar130;
    auVar25._8_4_ = uVar130;
    auVar25._12_4_ = uVar130;
    uVar136 = vcmpps_avx512vl(local_3d0,auVar25,2);
  }
  return uVar62 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }